

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersectorK<8,8>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  undefined1 auVar3 [16];
  Primitive PVar4;
  uint uVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  void *pvVar8;
  __int_type_conflict _Var9;
  undefined8 uVar10;
  bool bVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  byte bVar24;
  uint uVar25;
  ulong uVar26;
  uint uVar28;
  uint uVar29;
  long lVar30;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  ulong uVar31;
  uint uVar32;
  ulong uVar33;
  bool bVar34;
  bool bVar35;
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar72 [32];
  undefined1 auVar74 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar51 [16];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  int iVar103;
  float t1;
  float fVar104;
  undefined1 auVar105 [16];
  float fVar106;
  float fVar107;
  undefined4 uVar108;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar121 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  float fVar130;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  float fVar149;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  vfloat4 b0;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  vfloat4 b0_1;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar166 [16];
  undefined1 auVar177 [32];
  float fVar178;
  vfloat4 a0_3;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  vfloat4 a0_2;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  float fVar195;
  float fVar206;
  float fVar207;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar208;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar219;
  float fVar220;
  float fVar221;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  float fVar222;
  float fVar229;
  float fVar230;
  vfloat4 a0_1;
  float fVar231;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  vfloat4 a0;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [32];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [32];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  int iVar250;
  undefined1 in_ZMM30 [64];
  undefined1 auVar251 [64];
  undefined1 in_ZMM31 [64];
  undefined1 auVar252 [64];
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_5a1;
  float local_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  uint auStack_420 [4];
  RTCFilterFunctionNArguments local_410;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [16];
  undefined1 local_350 [16];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  undefined1 local_330 [16];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  uint uStack_280;
  float afStack_27c [7];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar27;
  undefined1 auVar71 [32];
  undefined1 auVar73 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  
  PVar4 = prim[1];
  uVar26 = (ulong)(byte)PVar4;
  fVar178 = *(float *)(prim + uVar26 * 0x19 + 0x12);
  auVar36 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar36 = vinsertps_avx(auVar36,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar46 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar37 = vinsertps_avx(auVar46,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar38 = vsubps_avx(auVar36,*(undefined1 (*) [16])(prim + uVar26 * 0x19 + 6));
  fVar130 = fVar178 * auVar38._0_4_;
  fVar104 = fVar178 * auVar37._0_4_;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar26 * 4 + 6);
  auVar68 = vpmovsxbd_avx2(auVar36);
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar26 * 5 + 6);
  auVar66 = vpmovsxbd_avx2(auVar46);
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar26 * 6 + 6);
  auVar67 = vpmovsxbd_avx2(auVar45);
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar26 * 0xb + 6);
  auVar82 = vpmovsxbd_avx2(auVar44);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6);
  auVar83 = vpmovsxbd_avx2(auVar43);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + (uint)(byte)PVar4 * 0xc + uVar26 + 6);
  auVar84 = vpmovsxbd_avx2(auVar42);
  auVar84 = vcvtdq2ps_avx(auVar84);
  uVar33 = (ulong)(uint)((int)(uVar26 * 9) * 2);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar33 + 6);
  auVar74 = vpmovsxbd_avx2(auVar41);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar33 + uVar26 + 6);
  auVar77 = vpmovsxbd_avx2(auVar40);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar75 = vcvtdq2ps_avx(auVar77);
  uVar31 = (ulong)(uint)((int)(uVar26 * 5) << 2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar31 + 6);
  auVar64 = vpmovsxbd_avx2(auVar3);
  auVar76 = vcvtdq2ps_avx(auVar64);
  auVar139._4_4_ = fVar104;
  auVar139._0_4_ = fVar104;
  auVar139._8_4_ = fVar104;
  auVar139._12_4_ = fVar104;
  auVar139._16_4_ = fVar104;
  auVar139._20_4_ = fVar104;
  auVar139._24_4_ = fVar104;
  auVar139._28_4_ = fVar104;
  auVar242._8_4_ = 1;
  auVar242._0_8_ = 0x100000001;
  auVar242._12_4_ = 1;
  auVar242._16_4_ = 1;
  auVar242._20_4_ = 1;
  auVar242._24_4_ = 1;
  auVar242._28_4_ = 1;
  auVar78 = ZEXT1632(CONCAT412(fVar178 * auVar37._12_4_,
                               CONCAT48(fVar178 * auVar37._8_4_,
                                        CONCAT44(fVar178 * auVar37._4_4_,fVar104))));
  auVar65 = vpermps_avx2(auVar242,auVar78);
  auVar62 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar63 = vpermps_avx512vl(auVar62,auVar78);
  fVar104 = auVar63._0_4_;
  fVar210 = auVar63._4_4_;
  auVar78._4_4_ = fVar210 * auVar67._4_4_;
  auVar78._0_4_ = fVar104 * auVar67._0_4_;
  fVar195 = auVar63._8_4_;
  auVar78._8_4_ = fVar195 * auVar67._8_4_;
  fVar206 = auVar63._12_4_;
  auVar78._12_4_ = fVar206 * auVar67._12_4_;
  fVar207 = auVar63._16_4_;
  auVar78._16_4_ = fVar207 * auVar67._16_4_;
  fVar106 = auVar63._20_4_;
  auVar78._20_4_ = fVar106 * auVar67._20_4_;
  fVar107 = auVar63._24_4_;
  auVar78._24_4_ = fVar107 * auVar67._24_4_;
  auVar78._28_4_ = auVar77._28_4_;
  auVar77._4_4_ = auVar84._4_4_ * fVar210;
  auVar77._0_4_ = auVar84._0_4_ * fVar104;
  auVar77._8_4_ = auVar84._8_4_ * fVar195;
  auVar77._12_4_ = auVar84._12_4_ * fVar206;
  auVar77._16_4_ = auVar84._16_4_ * fVar207;
  auVar77._20_4_ = auVar84._20_4_ * fVar106;
  auVar77._24_4_ = auVar84._24_4_ * fVar107;
  auVar77._28_4_ = auVar64._28_4_;
  auVar64._4_4_ = auVar76._4_4_ * fVar210;
  auVar64._0_4_ = auVar76._0_4_ * fVar104;
  auVar64._8_4_ = auVar76._8_4_ * fVar195;
  auVar64._12_4_ = auVar76._12_4_ * fVar206;
  auVar64._16_4_ = auVar76._16_4_ * fVar207;
  auVar64._20_4_ = auVar76._20_4_ * fVar106;
  auVar64._24_4_ = auVar76._24_4_ * fVar107;
  auVar64._28_4_ = auVar63._28_4_;
  auVar36 = vfmadd231ps_fma(auVar78,auVar65,auVar66);
  auVar46 = vfmadd231ps_fma(auVar77,auVar65,auVar83);
  auVar45 = vfmadd231ps_fma(auVar64,auVar75,auVar65);
  auVar36 = vfmadd231ps_fma(ZEXT1632(auVar36),auVar139,auVar68);
  auVar46 = vfmadd231ps_fma(ZEXT1632(auVar46),auVar139,auVar82);
  auVar45 = vfmadd231ps_fma(ZEXT1632(auVar45),auVar74,auVar139);
  auVar146._4_4_ = fVar130;
  auVar146._0_4_ = fVar130;
  auVar146._8_4_ = fVar130;
  auVar146._12_4_ = fVar130;
  auVar146._16_4_ = fVar130;
  auVar146._20_4_ = fVar130;
  auVar146._24_4_ = fVar130;
  auVar146._28_4_ = fVar130;
  auVar64 = ZEXT1632(CONCAT412(fVar178 * auVar38._12_4_,
                               CONCAT48(fVar178 * auVar38._8_4_,
                                        CONCAT44(fVar178 * auVar38._4_4_,fVar130))));
  auVar77 = vpermps_avx2(auVar242,auVar64);
  auVar64 = vpermps_avx512vl(auVar62,auVar64);
  auVar65 = vmulps_avx512vl(auVar64,auVar67);
  auVar80._0_4_ = auVar64._0_4_ * auVar84._0_4_;
  auVar80._4_4_ = auVar64._4_4_ * auVar84._4_4_;
  auVar80._8_4_ = auVar64._8_4_ * auVar84._8_4_;
  auVar80._12_4_ = auVar64._12_4_ * auVar84._12_4_;
  auVar80._16_4_ = auVar64._16_4_ * auVar84._16_4_;
  auVar80._20_4_ = auVar64._20_4_ * auVar84._20_4_;
  auVar80._24_4_ = auVar64._24_4_ * auVar84._24_4_;
  auVar80._28_4_ = 0;
  auVar84._4_4_ = auVar64._4_4_ * auVar76._4_4_;
  auVar84._0_4_ = auVar64._0_4_ * auVar76._0_4_;
  auVar84._8_4_ = auVar64._8_4_ * auVar76._8_4_;
  auVar84._12_4_ = auVar64._12_4_ * auVar76._12_4_;
  auVar84._16_4_ = auVar64._16_4_ * auVar76._16_4_;
  auVar84._20_4_ = auVar64._20_4_ * auVar76._20_4_;
  auVar84._24_4_ = auVar64._24_4_ * auVar76._24_4_;
  auVar84._28_4_ = auVar67._28_4_;
  auVar66 = vfmadd231ps_avx512vl(auVar65,auVar77,auVar66);
  auVar44 = vfmadd231ps_fma(auVar80,auVar77,auVar83);
  auVar43 = vfmadd231ps_fma(auVar84,auVar77,auVar75);
  auVar66 = vfmadd231ps_avx512vl(auVar66,auVar146,auVar68);
  auVar44 = vfmadd231ps_fma(ZEXT1632(auVar44),auVar146,auVar82);
  auVar43 = vfmadd231ps_fma(ZEXT1632(auVar43),auVar146,auVar74);
  auVar85._8_4_ = 0x7fffffff;
  auVar85._0_8_ = 0x7fffffff7fffffff;
  auVar85._12_4_ = 0x7fffffff;
  auVar85._16_4_ = 0x7fffffff;
  auVar85._20_4_ = 0x7fffffff;
  auVar85._24_4_ = 0x7fffffff;
  auVar85._28_4_ = 0x7fffffff;
  auVar68 = vandps_avx(ZEXT1632(auVar36),auVar85);
  auVar87._8_4_ = 0x219392ef;
  auVar87._0_8_ = 0x219392ef219392ef;
  auVar87._12_4_ = 0x219392ef;
  auVar87._16_4_ = 0x219392ef;
  auVar87._20_4_ = 0x219392ef;
  auVar87._24_4_ = 0x219392ef;
  auVar87._28_4_ = 0x219392ef;
  uVar33 = vcmpps_avx512vl(auVar68,auVar87,1);
  bVar34 = (bool)((byte)uVar33 & 1);
  auVar65._0_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar36._0_4_;
  bVar34 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar65._4_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar36._4_4_;
  bVar34 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar65._8_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar36._8_4_;
  bVar34 = (bool)((byte)(uVar33 >> 3) & 1);
  auVar65._12_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar36._12_4_;
  auVar65._16_4_ = (uint)((byte)(uVar33 >> 4) & 1) * 0x219392ef;
  auVar65._20_4_ = (uint)((byte)(uVar33 >> 5) & 1) * 0x219392ef;
  auVar65._24_4_ = (uint)((byte)(uVar33 >> 6) & 1) * 0x219392ef;
  auVar65._28_4_ = (uint)(byte)(uVar33 >> 7) * 0x219392ef;
  auVar68 = vandps_avx(ZEXT1632(auVar46),auVar85);
  uVar33 = vcmpps_avx512vl(auVar68,auVar87,1);
  bVar34 = (bool)((byte)uVar33 & 1);
  auVar62._0_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar46._0_4_;
  bVar34 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar62._4_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar46._4_4_;
  bVar34 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar62._8_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar46._8_4_;
  bVar34 = (bool)((byte)(uVar33 >> 3) & 1);
  auVar62._12_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar46._12_4_;
  auVar62._16_4_ = (uint)((byte)(uVar33 >> 4) & 1) * 0x219392ef;
  auVar62._20_4_ = (uint)((byte)(uVar33 >> 5) & 1) * 0x219392ef;
  auVar62._24_4_ = (uint)((byte)(uVar33 >> 6) & 1) * 0x219392ef;
  auVar62._28_4_ = (uint)(byte)(uVar33 >> 7) * 0x219392ef;
  auVar68 = vandps_avx(ZEXT1632(auVar45),auVar85);
  uVar33 = vcmpps_avx512vl(auVar68,auVar87,1);
  bVar34 = (bool)((byte)uVar33 & 1);
  auVar68._0_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar45._0_4_;
  bVar34 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar68._4_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar45._4_4_;
  bVar34 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar68._8_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar45._8_4_;
  bVar34 = (bool)((byte)(uVar33 >> 3) & 1);
  auVar68._12_4_ = (uint)bVar34 * 0x219392ef | (uint)!bVar34 * auVar45._12_4_;
  auVar68._16_4_ = (uint)((byte)(uVar33 >> 4) & 1) * 0x219392ef;
  auVar68._20_4_ = (uint)((byte)(uVar33 >> 5) & 1) * 0x219392ef;
  auVar68._24_4_ = (uint)((byte)(uVar33 >> 6) & 1) * 0x219392ef;
  auVar68._28_4_ = (uint)(byte)(uVar33 >> 7) * 0x219392ef;
  auVar67 = vrcp14ps_avx512vl(auVar65);
  auVar86._8_4_ = 0x3f800000;
  auVar86._0_8_ = &DAT_3f8000003f800000;
  auVar86._12_4_ = 0x3f800000;
  auVar86._16_4_ = 0x3f800000;
  auVar86._20_4_ = 0x3f800000;
  auVar86._24_4_ = 0x3f800000;
  auVar86._28_4_ = 0x3f800000;
  auVar36 = vfnmadd213ps_fma(auVar65,auVar67,auVar86);
  auVar36 = vfmadd132ps_fma(ZEXT1632(auVar36),auVar67,auVar67);
  auVar67 = vrcp14ps_avx512vl(auVar62);
  auVar46 = vfnmadd213ps_fma(auVar62,auVar67,auVar86);
  auVar46 = vfmadd132ps_fma(ZEXT1632(auVar46),auVar67,auVar67);
  auVar67 = vrcp14ps_avx512vl(auVar68);
  auVar45 = vfnmadd213ps_fma(auVar68,auVar67,auVar86);
  auVar45 = vfmadd132ps_fma(ZEXT1632(auVar45),auVar67,auVar67);
  auVar68 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar26 * 7 + 6));
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar67 = vsubps_avx512vl(auVar68,auVar66);
  auVar68 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar26 * 9 + 6));
  auVar74._4_4_ = auVar36._4_4_ * auVar67._4_4_;
  auVar74._0_4_ = auVar36._0_4_ * auVar67._0_4_;
  auVar74._8_4_ = auVar36._8_4_ * auVar67._8_4_;
  auVar74._12_4_ = auVar36._12_4_ * auVar67._12_4_;
  auVar74._16_4_ = auVar67._16_4_ * 0.0;
  auVar74._20_4_ = auVar67._20_4_ * 0.0;
  auVar74._24_4_ = auVar67._24_4_ * 0.0;
  auVar74._28_4_ = auVar67._28_4_;
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar68 = vsubps_avx512vl(auVar68,auVar66);
  auVar81._0_4_ = auVar36._0_4_ * auVar68._0_4_;
  auVar81._4_4_ = auVar36._4_4_ * auVar68._4_4_;
  auVar81._8_4_ = auVar36._8_4_ * auVar68._8_4_;
  auVar81._12_4_ = auVar36._12_4_ * auVar68._12_4_;
  auVar81._16_4_ = auVar68._16_4_ * 0.0;
  auVar81._20_4_ = auVar68._20_4_ * 0.0;
  auVar81._24_4_ = auVar68._24_4_ * 0.0;
  auVar81._28_4_ = 0;
  auVar66 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar4 * 0x10 + 6));
  auVar68 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar4 * 0x10 + uVar26 * -2 + 6));
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar68 = vsubps_avx(auVar68,ZEXT1632(auVar44));
  auVar75._4_4_ = auVar46._4_4_ * auVar68._4_4_;
  auVar75._0_4_ = auVar46._0_4_ * auVar68._0_4_;
  auVar75._8_4_ = auVar46._8_4_ * auVar68._8_4_;
  auVar75._12_4_ = auVar46._12_4_ * auVar68._12_4_;
  auVar75._16_4_ = auVar68._16_4_ * 0.0;
  auVar75._20_4_ = auVar68._20_4_ * 0.0;
  auVar75._24_4_ = auVar68._24_4_ * 0.0;
  auVar75._28_4_ = auVar68._28_4_;
  auVar68 = vcvtdq2ps_avx(auVar66);
  auVar68 = vsubps_avx(auVar68,ZEXT1632(auVar44));
  auVar79._0_4_ = auVar46._0_4_ * auVar68._0_4_;
  auVar79._4_4_ = auVar46._4_4_ * auVar68._4_4_;
  auVar79._8_4_ = auVar46._8_4_ * auVar68._8_4_;
  auVar79._12_4_ = auVar46._12_4_ * auVar68._12_4_;
  auVar79._16_4_ = auVar68._16_4_ * 0.0;
  auVar79._20_4_ = auVar68._20_4_ * 0.0;
  auVar79._24_4_ = auVar68._24_4_ * 0.0;
  auVar79._28_4_ = 0;
  auVar68 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 + uVar26 + 6));
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar68 = vsubps_avx(auVar68,ZEXT1632(auVar43));
  auVar76._4_4_ = auVar68._4_4_ * auVar45._4_4_;
  auVar76._0_4_ = auVar68._0_4_ * auVar45._0_4_;
  auVar76._8_4_ = auVar68._8_4_ * auVar45._8_4_;
  auVar76._12_4_ = auVar68._12_4_ * auVar45._12_4_;
  auVar76._16_4_ = auVar68._16_4_ * 0.0;
  auVar76._20_4_ = auVar68._20_4_ * 0.0;
  auVar76._24_4_ = auVar68._24_4_ * 0.0;
  auVar76._28_4_ = auVar68._28_4_;
  auVar68 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar26 * 0x17 + 6));
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar68 = vsubps_avx(auVar68,ZEXT1632(auVar43));
  auVar63._0_4_ = auVar45._0_4_ * auVar68._0_4_;
  auVar63._4_4_ = auVar45._4_4_ * auVar68._4_4_;
  auVar63._8_4_ = auVar45._8_4_ * auVar68._8_4_;
  auVar63._12_4_ = auVar45._12_4_ * auVar68._12_4_;
  auVar63._16_4_ = auVar68._16_4_ * 0.0;
  auVar63._20_4_ = auVar68._20_4_ * 0.0;
  auVar63._24_4_ = auVar68._24_4_ * 0.0;
  auVar63._28_4_ = 0;
  auVar68 = vpminsd_avx2(auVar74,auVar81);
  auVar66 = vpminsd_avx2(auVar75,auVar79);
  auVar68 = vmaxps_avx(auVar68,auVar66);
  auVar66 = vpminsd_avx2(auVar76,auVar63);
  uVar108 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar67._4_4_ = uVar108;
  auVar67._0_4_ = uVar108;
  auVar67._8_4_ = uVar108;
  auVar67._12_4_ = uVar108;
  auVar67._16_4_ = uVar108;
  auVar67._20_4_ = uVar108;
  auVar67._24_4_ = uVar108;
  auVar67._28_4_ = uVar108;
  auVar66 = vmaxps_avx512vl(auVar66,auVar67);
  auVar68 = vmaxps_avx(auVar68,auVar66);
  auVar66._8_4_ = 0x3f7ffffa;
  auVar66._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar66._12_4_ = 0x3f7ffffa;
  auVar66._16_4_ = 0x3f7ffffa;
  auVar66._20_4_ = 0x3f7ffffa;
  auVar66._24_4_ = 0x3f7ffffa;
  auVar66._28_4_ = 0x3f7ffffa;
  local_200 = vmulps_avx512vl(auVar68,auVar66);
  auVar68 = vpmaxsd_avx2(auVar74,auVar81);
  auVar66 = vpmaxsd_avx2(auVar75,auVar79);
  auVar68 = vminps_avx(auVar68,auVar66);
  auVar66 = vpmaxsd_avx2(auVar76,auVar63);
  uVar108 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar82._4_4_ = uVar108;
  auVar82._0_4_ = uVar108;
  auVar82._8_4_ = uVar108;
  auVar82._12_4_ = uVar108;
  auVar82._16_4_ = uVar108;
  auVar82._20_4_ = uVar108;
  auVar82._24_4_ = uVar108;
  auVar82._28_4_ = uVar108;
  auVar66 = vminps_avx512vl(auVar66,auVar82);
  auVar68 = vminps_avx(auVar68,auVar66);
  auVar83._8_4_ = 0x3f800003;
  auVar83._0_8_ = 0x3f8000033f800003;
  auVar83._12_4_ = 0x3f800003;
  auVar83._16_4_ = 0x3f800003;
  auVar83._20_4_ = 0x3f800003;
  auVar83._24_4_ = 0x3f800003;
  auVar83._28_4_ = 0x3f800003;
  auVar68 = vmulps_avx512vl(auVar68,auVar83);
  auVar66 = vpbroadcastd_avx512vl();
  uVar12 = vpcmpgtd_avx512vl(auVar66,_DAT_0205a920);
  uVar10 = vcmpps_avx512vl(local_200,auVar68,2);
  bVar34 = (byte)((byte)uVar10 & (byte)uVar12) == 0;
  local_5a1 = !bVar34;
  if (bVar34) {
    return local_5a1;
  }
  uVar33 = (ulong)(byte)((byte)uVar10 & (byte)uVar12);
  local_260 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar69._16_16_ = auVar66._16_16_;
  auVar36 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
  auVar252 = ZEXT1664(auVar36);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar244 = ZEXT1664(auVar36);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar245 = ZEXT1664(auVar36);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar246 = ZEXT1664(auVar36);
  auVar69._0_16_ = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar251 = ZEXT1664(auVar69._0_16_);
LAB_01d31e7f:
  lVar30 = 0;
  for (uVar26 = uVar33; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
    lVar30 = lVar30 + 1;
  }
  uVar32 = *(uint *)(prim + 2);
  pGVar6 = (context->scene->geometries).items[uVar32].ptr;
  uVar26 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar30 * 4 + 6));
  p_Var7 = pGVar6[1].intersectionFilterN;
  pvVar8 = pGVar6[2].userPtr;
  _Var9 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar36 = *(undefined1 (*) [16])(_Var9 + uVar26 * (long)pvVar8);
  auVar46 = *(undefined1 (*) [16])(_Var9 + (uVar26 + 1) * (long)pvVar8);
  auVar45 = *(undefined1 (*) [16])(_Var9 + (uVar26 + 2) * (long)pvVar8);
  auVar44 = *(undefined1 (*) [16])(_Var9 + (long)pvVar8 * (uVar26 + 3));
  lVar30 = *(long *)&pGVar6[1].time_range.upper;
  auVar43 = *(undefined1 (*) [16])(lVar30 + (long)p_Var7 * uVar26);
  auVar42 = *(undefined1 (*) [16])(lVar30 + (long)p_Var7 * (uVar26 + 1));
  auVar41 = *(undefined1 (*) [16])(lVar30 + (long)p_Var7 * (uVar26 + 2));
  uVar33 = uVar33 - 1 & uVar33;
  auVar40 = *(undefined1 (*) [16])(lVar30 + (long)p_Var7 * (uVar26 + 3));
  if (uVar33 != 0) {
    uVar31 = uVar33 - 1 & uVar33;
    for (uVar26 = uVar33; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
    }
    if (uVar31 != 0) {
      for (; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar3 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c
                        );
  auVar3 = vinsertps_avx(auVar3,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar71._16_16_ = auVar69._16_16_;
  auVar119 = auVar252._0_16_;
  auVar37 = vmulps_avx512vl(auVar40,auVar119);
  auVar38 = vfmadd231ps_avx512vl(auVar37,auVar41,auVar119);
  auVar37 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar42,auVar38);
  auVar47._0_4_ = auVar43._0_4_ + auVar37._0_4_;
  auVar47._4_4_ = auVar43._4_4_ + auVar37._4_4_;
  auVar47._8_4_ = auVar43._8_4_ + auVar37._8_4_;
  auVar47._12_4_ = auVar43._12_4_ + auVar37._12_4_;
  auVar118 = auVar244._0_16_;
  auVar37 = vfmadd231ps_avx512vl(auVar38,auVar42,auVar118);
  auVar38 = vfnmadd231ps_avx512vl(auVar37,auVar43,auVar118);
  auVar37 = vmulps_avx512vl(auVar44,auVar119);
  auVar39 = vfmadd231ps_avx512vl(auVar37,auVar45,auVar119);
  auVar37 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar46,auVar39);
  auVar232._0_4_ = auVar36._0_4_ + auVar37._0_4_;
  auVar232._4_4_ = auVar36._4_4_ + auVar37._4_4_;
  auVar232._8_4_ = auVar36._8_4_ + auVar37._8_4_;
  auVar232._12_4_ = auVar36._12_4_ + auVar37._12_4_;
  auVar37 = vfmadd231ps_avx512vl(auVar39,auVar46,auVar118);
  auVar39 = vfnmadd231ps_avx512vl(auVar37,auVar36,auVar118);
  auVar37 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar41,auVar40);
  auVar37 = vfmadd231ps_avx512vl(auVar37,auVar42,auVar119);
  auVar37 = vfmadd231ps_avx512vl(auVar37,auVar43,auVar119);
  auVar40 = vmulps_avx512vl(auVar40,auVar118);
  auVar41 = vfnmadd231ps_avx512vl(auVar40,auVar118,auVar41);
  auVar42 = vfmadd231ps_avx512vl(auVar41,auVar119,auVar42);
  auVar41 = vfnmadd231ps_avx512vl(auVar42,auVar119,auVar43);
  auVar43 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar45,auVar44);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar46,auVar119);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar36,auVar119);
  auVar44 = vmulps_avx512vl(auVar44,auVar118);
  auVar45 = vfnmadd231ps_avx512vl(auVar44,auVar118,auVar45);
  auVar46 = vfmadd231ps_avx512vl(auVar45,auVar119,auVar46);
  auVar42 = vfnmadd231ps_avx512vl(auVar46,auVar119,auVar36);
  auVar36 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar46 = vshufps_avx(auVar232,auVar232,0xc9);
  fVar206 = auVar38._0_4_;
  auVar60._0_4_ = fVar206 * auVar46._0_4_;
  fVar207 = auVar38._4_4_;
  auVar60._4_4_ = fVar207 * auVar46._4_4_;
  fVar106 = auVar38._8_4_;
  auVar60._8_4_ = fVar106 * auVar46._8_4_;
  fVar107 = auVar38._12_4_;
  auVar60._12_4_ = fVar107 * auVar46._12_4_;
  auVar46 = vfmsub231ps_fma(auVar60,auVar36,auVar232);
  auVar45 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar46 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar58._0_4_ = fVar206 * auVar46._0_4_;
  auVar58._4_4_ = fVar207 * auVar46._4_4_;
  auVar58._8_4_ = fVar106 * auVar46._8_4_;
  auVar58._12_4_ = fVar107 * auVar46._12_4_;
  auVar36 = vfmsub231ps_fma(auVar58,auVar36,auVar39);
  auVar44 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar36 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar46 = vshufps_avx(auVar43,auVar43,0xc9);
  fVar130 = auVar41._0_4_;
  auVar50._0_4_ = fVar130 * auVar46._0_4_;
  fVar149 = auVar41._4_4_;
  auVar50._4_4_ = fVar149 * auVar46._4_4_;
  fVar208 = auVar41._8_4_;
  auVar50._8_4_ = fVar208 * auVar46._8_4_;
  fVar209 = auVar41._12_4_;
  auVar50._12_4_ = fVar209 * auVar46._12_4_;
  auVar46 = vfmsub231ps_fma(auVar50,auVar36,auVar43);
  auVar43 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar46 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar187._0_4_ = auVar46._0_4_ * fVar130;
  auVar187._4_4_ = auVar46._4_4_ * fVar149;
  auVar187._8_4_ = auVar46._8_4_ * fVar208;
  auVar187._12_4_ = auVar46._12_4_ * fVar209;
  auVar36 = vfmsub231ps_fma(auVar187,auVar36,auVar42);
  auVar42 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar36 = vdpps_avx(auVar45,auVar45,0x7f);
  fVar178 = auVar36._0_4_;
  auVar71._0_16_ = auVar119;
  auVar70._4_28_ = auVar71._4_28_;
  auVar70._0_4_ = fVar178;
  auVar46 = vrsqrt14ss_avx512f(auVar119,auVar70._0_16_);
  fVar104 = auVar46._0_4_;
  auVar46 = vmulss_avx512f(auVar36,ZEXT416(0x3f000000));
  fVar210 = fVar104 * 1.5 - auVar46._0_4_ * fVar104 * fVar104 * fVar104;
  fVar222 = fVar210 * auVar45._0_4_;
  fVar229 = fVar210 * auVar45._4_4_;
  fVar230 = fVar210 * auVar45._8_4_;
  fVar231 = fVar210 * auVar45._12_4_;
  auVar46 = vdpps_avx(auVar45,auVar44,0x7f);
  auVar196._0_4_ = auVar44._0_4_ * fVar178;
  auVar196._4_4_ = auVar44._4_4_ * fVar178;
  auVar196._8_4_ = auVar44._8_4_ * fVar178;
  auVar196._12_4_ = auVar44._12_4_ * fVar178;
  fVar178 = auVar46._0_4_;
  auVar56._0_4_ = fVar178 * auVar45._0_4_;
  auVar56._4_4_ = fVar178 * auVar45._4_4_;
  auVar56._8_4_ = fVar178 * auVar45._8_4_;
  auVar56._12_4_ = fVar178 * auVar45._12_4_;
  auVar45 = vsubps_avx(auVar196,auVar56);
  auVar46 = vrcp14ss_avx512f(auVar119,auVar70._0_16_);
  auVar36 = vfnmadd213ss_avx512f(auVar36,auVar46,ZEXT416(0x40000000));
  fVar178 = auVar46._0_4_ * auVar36._0_4_;
  auVar36 = vdpps_avx(auVar43,auVar43,0x7f);
  fVar104 = auVar36._0_4_;
  auVar73._16_16_ = auVar71._16_16_;
  auVar73._0_16_ = auVar119;
  auVar72._4_28_ = auVar73._4_28_;
  auVar72._0_4_ = fVar104;
  auVar46 = vrsqrt14ss_avx512f(auVar119,auVar72._0_16_);
  fVar195 = auVar46._0_4_;
  auVar46 = vmulss_avx512f(auVar36,ZEXT416(0x3f000000));
  fVar195 = fVar195 * 1.5 - auVar46._0_4_ * fVar195 * fVar195 * fVar195;
  fVar211 = fVar195 * auVar43._0_4_;
  fVar219 = fVar195 * auVar43._4_4_;
  fVar220 = fVar195 * auVar43._8_4_;
  fVar221 = fVar195 * auVar43._12_4_;
  auVar46 = vdpps_avx(auVar43,auVar42,0x7f);
  auVar53._0_4_ = fVar104 * auVar42._0_4_;
  auVar53._4_4_ = fVar104 * auVar42._4_4_;
  auVar53._8_4_ = fVar104 * auVar42._8_4_;
  auVar53._12_4_ = fVar104 * auVar42._12_4_;
  fVar104 = auVar46._0_4_;
  auVar59._0_4_ = fVar104 * auVar43._0_4_;
  auVar59._4_4_ = fVar104 * auVar43._4_4_;
  auVar59._8_4_ = fVar104 * auVar43._8_4_;
  auVar59._12_4_ = fVar104 * auVar43._12_4_;
  auVar44 = vsubps_avx(auVar53,auVar59);
  auVar46 = vrcp14ss_avx512f(auVar119,auVar72._0_16_);
  auVar36 = vfnmadd213ss_avx512f(auVar36,auVar46,ZEXT416(0x40000000));
  fVar104 = auVar36._0_4_ * auVar46._0_4_;
  auVar36 = vshufps_avx(auVar47,auVar47,0xff);
  auVar179._0_4_ = fVar222 * auVar36._0_4_;
  auVar179._4_4_ = fVar229 * auVar36._4_4_;
  auVar179._8_4_ = fVar230 * auVar36._8_4_;
  auVar179._12_4_ = fVar231 * auVar36._12_4_;
  local_310 = vsubps_avx(auVar47,auVar179);
  auVar46 = vshufps_avx(auVar38,auVar38,0xff);
  auVar54._0_4_ = auVar46._0_4_ * fVar222 + auVar36._0_4_ * fVar210 * fVar178 * auVar45._0_4_;
  auVar54._4_4_ = auVar46._4_4_ * fVar229 + auVar36._4_4_ * fVar210 * fVar178 * auVar45._4_4_;
  auVar54._8_4_ = auVar46._8_4_ * fVar230 + auVar36._8_4_ * fVar210 * fVar178 * auVar45._8_4_;
  auVar54._12_4_ = auVar46._12_4_ * fVar231 + auVar36._12_4_ * fVar210 * fVar178 * auVar45._12_4_;
  auVar45 = vsubps_avx(auVar38,auVar54);
  local_320._0_4_ = auVar179._0_4_ + auVar47._0_4_;
  local_320._4_4_ = auVar179._4_4_ + auVar47._4_4_;
  fStack_318 = auVar179._8_4_ + auVar47._8_4_;
  fStack_314 = auVar179._12_4_ + auVar47._12_4_;
  auVar36 = vshufps_avx(auVar37,auVar37,0xff);
  auVar55._0_4_ = fVar211 * auVar36._0_4_;
  auVar55._4_4_ = fVar219 * auVar36._4_4_;
  auVar55._8_4_ = fVar220 * auVar36._8_4_;
  auVar55._12_4_ = fVar221 * auVar36._12_4_;
  local_330 = vsubps_avx(auVar37,auVar55);
  auVar46 = vshufps_avx(auVar41,auVar41,0xff);
  auVar118._0_4_ = auVar46._0_4_ * fVar211 + auVar36._0_4_ * fVar195 * auVar44._0_4_ * fVar104;
  auVar118._4_4_ = auVar46._4_4_ * fVar219 + auVar36._4_4_ * fVar195 * auVar44._4_4_ * fVar104;
  auVar118._8_4_ = auVar46._8_4_ * fVar220 + auVar36._8_4_ * fVar195 * auVar44._8_4_ * fVar104;
  auVar118._12_4_ = auVar46._12_4_ * fVar221 + auVar36._12_4_ * fVar195 * auVar44._12_4_ * fVar104;
  auVar36 = vsubps_avx(auVar41,auVar118);
  _local_340 = vaddps_avx512vl(auVar37,auVar55);
  auVar131._0_4_ = auVar45._0_4_ * 0.33333334;
  auVar131._4_4_ = auVar45._4_4_ * 0.33333334;
  auVar131._8_4_ = auVar45._8_4_ * 0.33333334;
  auVar131._12_4_ = auVar45._12_4_ * 0.33333334;
  local_350 = vaddps_avx512vl(local_310,auVar131);
  auVar52._0_4_ = auVar36._0_4_ * 0.33333334;
  auVar52._4_4_ = auVar36._4_4_ * 0.33333334;
  auVar52._8_4_ = auVar36._8_4_ * 0.33333334;
  auVar52._12_4_ = auVar36._12_4_ * 0.33333334;
  local_360 = vsubps_avx512vl(local_330,auVar52);
  auVar37._0_4_ = (fVar206 + auVar54._0_4_) * 0.33333334;
  auVar37._4_4_ = (fVar207 + auVar54._4_4_) * 0.33333334;
  auVar37._8_4_ = (fVar106 + auVar54._8_4_) * 0.33333334;
  auVar37._12_4_ = (fVar107 + auVar54._12_4_) * 0.33333334;
  _local_370 = vaddps_avx512vl(_local_320,auVar37);
  auVar38._0_4_ = (fVar130 + auVar118._0_4_) * 0.33333334;
  auVar38._4_4_ = (fVar149 + auVar118._4_4_) * 0.33333334;
  auVar38._8_4_ = (fVar208 + auVar118._8_4_) * 0.33333334;
  auVar38._12_4_ = (fVar209 + auVar118._12_4_) * 0.33333334;
  _local_380 = vsubps_avx512vl(_local_340,auVar38);
  local_290 = vsubps_avx(local_310,auVar3);
  uVar108 = local_290._0_4_;
  auVar119._4_4_ = uVar108;
  auVar119._0_4_ = uVar108;
  auVar119._8_4_ = uVar108;
  auVar119._12_4_ = uVar108;
  auVar36 = vshufps_avx(local_290,local_290,0x55);
  auVar46 = vshufps_avx(local_290,local_290,0xaa);
  aVar1 = pre->ray_space[k].vx.field_0;
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar178 = pre->ray_space[k].vz.field_0.m128[0];
  fVar104 = pre->ray_space[k].vz.field_0.m128[1];
  fVar210 = pre->ray_space[k].vz.field_0.m128[2];
  fVar195 = pre->ray_space[k].vz.field_0.m128[3];
  auVar39._0_4_ = fVar178 * auVar46._0_4_;
  auVar39._4_4_ = fVar104 * auVar46._4_4_;
  auVar39._8_4_ = fVar210 * auVar46._8_4_;
  auVar39._12_4_ = fVar195 * auVar46._12_4_;
  auVar36 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar2,auVar36);
  auVar37 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar1,auVar119);
  local_2a0 = vsubps_avx512vl(local_350,auVar3);
  uVar108 = local_2a0._0_4_;
  auVar49._4_4_ = uVar108;
  auVar49._0_4_ = uVar108;
  auVar49._8_4_ = uVar108;
  auVar49._12_4_ = uVar108;
  auVar36 = vshufps_avx(local_2a0,local_2a0,0x55);
  auVar46 = vshufps_avx(local_2a0,local_2a0,0xaa);
  auVar120._0_4_ = fVar178 * auVar46._0_4_;
  auVar120._4_4_ = fVar104 * auVar46._4_4_;
  auVar120._8_4_ = fVar210 * auVar46._8_4_;
  auVar120._12_4_ = fVar195 * auVar46._12_4_;
  auVar36 = vfmadd231ps_fma(auVar120,(undefined1  [16])aVar2,auVar36);
  auVar38 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar1,auVar49);
  local_2b0 = vsubps_avx512vl(local_360,auVar3);
  uVar108 = local_2b0._0_4_;
  auVar57._4_4_ = uVar108;
  auVar57._0_4_ = uVar108;
  auVar57._8_4_ = uVar108;
  auVar57._12_4_ = uVar108;
  auVar36 = vshufps_avx(local_2b0,local_2b0,0x55);
  auVar46 = vshufps_avx(local_2b0,local_2b0,0xaa);
  auVar51._0_4_ = fVar178 * auVar46._0_4_;
  auVar51._4_4_ = fVar104 * auVar46._4_4_;
  auVar51._8_4_ = fVar210 * auVar46._8_4_;
  auVar51._12_4_ = fVar195 * auVar46._12_4_;
  auVar36 = vfmadd231ps_fma(auVar51,(undefined1  [16])aVar2,auVar36);
  auVar39 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar1,auVar57);
  local_2c0 = vsubps_avx(local_330,auVar3);
  uVar108 = local_2c0._0_4_;
  auVar163._4_4_ = uVar108;
  auVar163._0_4_ = uVar108;
  auVar163._8_4_ = uVar108;
  auVar163._12_4_ = uVar108;
  auVar36 = vshufps_avx(local_2c0,local_2c0,0x55);
  auVar46 = vshufps_avx(local_2c0,local_2c0,0xaa);
  auVar188._0_4_ = auVar46._0_4_ * fVar178;
  auVar188._4_4_ = auVar46._4_4_ * fVar104;
  auVar188._8_4_ = auVar46._8_4_ * fVar210;
  auVar188._12_4_ = auVar46._12_4_ * fVar195;
  auVar36 = vfmadd231ps_fma(auVar188,(undefined1  [16])aVar2,auVar36);
  auVar47 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar1,auVar163);
  local_2d0 = vsubps_avx(_local_320,auVar3);
  uVar108 = local_2d0._0_4_;
  auVar61._4_4_ = uVar108;
  auVar61._0_4_ = uVar108;
  auVar61._8_4_ = uVar108;
  auVar61._12_4_ = uVar108;
  auVar36 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar46 = vshufps_avx(local_2d0,local_2d0,0xaa);
  auVar197._0_4_ = auVar46._0_4_ * fVar178;
  auVar197._4_4_ = auVar46._4_4_ * fVar104;
  auVar197._8_4_ = auVar46._8_4_ * fVar210;
  auVar197._12_4_ = auVar46._12_4_ * fVar195;
  auVar36 = vfmadd231ps_fma(auVar197,(undefined1  [16])aVar2,auVar36);
  auVar118 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar1,auVar61);
  local_2e0 = vsubps_avx512vl(_local_370,auVar3);
  uVar108 = local_2e0._0_4_;
  auVar164._4_4_ = uVar108;
  auVar164._0_4_ = uVar108;
  auVar164._8_4_ = uVar108;
  auVar164._12_4_ = uVar108;
  auVar36 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar46 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar212._0_4_ = auVar46._0_4_ * fVar178;
  auVar212._4_4_ = auVar46._4_4_ * fVar104;
  auVar212._8_4_ = auVar46._8_4_ * fVar210;
  auVar212._12_4_ = auVar46._12_4_ * fVar195;
  auVar36 = vfmadd231ps_fma(auVar212,(undefined1  [16])aVar2,auVar36);
  auVar119 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar1,auVar164);
  local_2f0 = vsubps_avx512vl(_local_380,auVar3);
  uVar108 = local_2f0._0_4_;
  auVar165._4_4_ = uVar108;
  auVar165._0_4_ = uVar108;
  auVar165._8_4_ = uVar108;
  auVar165._12_4_ = uVar108;
  auVar36 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar46 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar223._0_4_ = auVar46._0_4_ * fVar178;
  auVar223._4_4_ = auVar46._4_4_ * fVar104;
  auVar223._8_4_ = auVar46._8_4_ * fVar210;
  auVar223._12_4_ = auVar46._12_4_ * fVar195;
  auVar36 = vfmadd231ps_fma(auVar223,(undefined1  [16])aVar2,auVar36);
  auVar120 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar1,auVar165);
  local_300 = vsubps_avx512vl(_local_340,auVar3);
  uVar108 = local_300._0_4_;
  auVar48._4_4_ = uVar108;
  auVar48._0_4_ = uVar108;
  auVar48._8_4_ = uVar108;
  auVar48._12_4_ = uVar108;
  auVar36 = vshufps_avx(local_300,local_300,0x55);
  auVar46 = vshufps_avx(local_300,local_300,0xaa);
  auVar157._0_4_ = auVar46._0_4_ * fVar178;
  auVar157._4_4_ = auVar46._4_4_ * fVar104;
  auVar157._8_4_ = auVar46._8_4_ * fVar210;
  auVar157._12_4_ = auVar46._12_4_ * fVar195;
  auVar36 = vfmadd231ps_fma(auVar157,(undefined1  [16])aVar2,auVar36);
  auVar3 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar1,auVar48);
  auVar45 = vmovlhps_avx(auVar37,auVar118);
  auVar42 = vmovlhps_avx512f(auVar38,auVar119);
  auVar41 = vmovlhps_avx512f(auVar39,auVar120);
  auVar40 = vmovlhps_avx512f(auVar47,auVar3);
  auVar36 = vminps_avx512vl(auVar45,auVar42);
  auVar44 = vmaxps_avx512vl(auVar45,auVar42);
  auVar46 = vminps_avx512vl(auVar41,auVar40);
  auVar46 = vminps_avx(auVar36,auVar46);
  auVar36 = vmaxps_avx512vl(auVar41,auVar40);
  auVar36 = vmaxps_avx(auVar44,auVar36);
  auVar44 = vshufpd_avx(auVar46,auVar46,3);
  auVar43 = vshufpd_avx(auVar36,auVar36,3);
  auVar46 = vminps_avx(auVar46,auVar44);
  auVar36 = vmaxps_avx(auVar36,auVar43);
  auVar46 = vandps_avx512vl(auVar46,auVar245._0_16_);
  auVar36 = vandps_avx512vl(auVar36,auVar245._0_16_);
  auVar36 = vmaxps_avx(auVar46,auVar36);
  auVar46 = vmovshdup_avx(auVar36);
  auVar36 = vmaxss_avx(auVar46,auVar36);
  fVar104 = auVar36._0_4_ * 9.536743e-07;
  auVar166._8_8_ = auVar37._0_8_;
  auVar166._0_8_ = auVar37._0_8_;
  auVar46 = vmovddup_avx512vl(auVar38);
  auVar109._8_8_ = auVar39._0_8_;
  auVar109._0_8_ = auVar39._0_8_;
  auVar121._8_8_ = auVar47._0_8_;
  auVar121._0_8_ = auVar47._0_8_;
  local_1c0 = vbroadcastss_avx512vl(ZEXT416((uint)fVar104));
  auVar36 = vxorps_avx512vl(local_1c0._0_16_,auVar246._0_16_);
  local_1e0 = vbroadcastss_avx512vl(auVar36);
  local_220 = vpbroadcastd_avx512vl();
  bVar34 = false;
  uVar26 = 0;
  fVar178 = *(float *)(ray + k * 4 + 0x60);
  auVar44 = vsubps_avx512vl(auVar42,auVar45);
  auVar43 = vsubps_avx512vl(auVar41,auVar42);
  auVar88._0_16_ = vsubps_avx512vl(auVar40,auVar41);
  local_390 = vsubps_avx(_local_320,local_310);
  local_3a0 = vsubps_avx512vl(_local_370,local_350);
  local_3b0 = vsubps_avx512vl(_local_380,local_360);
  _local_3c0 = vsubps_avx512vl(_local_340,local_330);
  local_240 = vpbroadcastd_avx512vl();
  auVar36 = ZEXT816(0x3f80000000000000);
  auVar243 = ZEXT1664(auVar36);
  do {
    auVar49 = auVar243._0_16_;
    auVar37 = vshufps_avx(auVar49,auVar49,0x50);
    auVar74 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar39 = vsubps_avx512vl(auVar74._0_16_,auVar37);
    fVar210 = auVar37._0_4_;
    fVar221 = auVar118._0_4_;
    auVar132._0_4_ = fVar221 * fVar210;
    fVar195 = auVar37._4_4_;
    fVar222 = auVar118._4_4_;
    auVar132._4_4_ = fVar222 * fVar195;
    fVar206 = auVar37._8_4_;
    auVar132._8_4_ = fVar221 * fVar206;
    fVar207 = auVar37._12_4_;
    auVar132._12_4_ = fVar222 * fVar207;
    fVar106 = auVar119._0_4_;
    auVar142._0_4_ = fVar106 * fVar210;
    fVar107 = auVar119._4_4_;
    auVar142._4_4_ = fVar107 * fVar195;
    auVar142._8_4_ = fVar106 * fVar206;
    auVar142._12_4_ = fVar107 * fVar207;
    fVar130 = auVar120._0_4_;
    auVar150._0_4_ = fVar130 * fVar210;
    fVar149 = auVar120._4_4_;
    auVar150._4_4_ = fVar149 * fVar195;
    auVar150._8_4_ = fVar130 * fVar206;
    auVar150._12_4_ = fVar149 * fVar207;
    fVar219 = auVar3._0_4_;
    auVar110._0_4_ = fVar219 * fVar210;
    fVar220 = auVar3._4_4_;
    auVar110._4_4_ = fVar220 * fVar195;
    auVar110._8_4_ = fVar219 * fVar206;
    auVar110._12_4_ = fVar220 * fVar207;
    auVar38 = vfmadd231ps_fma(auVar132,auVar39,auVar166);
    auVar47 = vfmadd231ps_avx512vl(auVar142,auVar39,auVar46);
    auVar48 = vfmadd231ps_avx512vl(auVar150,auVar39,auVar109);
    auVar39 = vfmadd231ps_fma(auVar110,auVar121,auVar39);
    auVar37 = vmovshdup_avx(auVar36);
    fVar195 = auVar36._0_4_;
    fVar210 = (auVar37._0_4_ - fVar195) * 0.04761905;
    auVar177._4_4_ = fVar195;
    auVar177._0_4_ = fVar195;
    auVar177._8_4_ = fVar195;
    auVar177._12_4_ = fVar195;
    auVar177._16_4_ = fVar195;
    auVar177._20_4_ = fVar195;
    auVar177._24_4_ = fVar195;
    auVar177._28_4_ = fVar195;
    auVar127._0_8_ = auVar37._0_8_;
    auVar127._8_8_ = auVar127._0_8_;
    auVar127._16_8_ = auVar127._0_8_;
    auVar127._24_8_ = auVar127._0_8_;
    auVar68 = vsubps_avx(auVar127,auVar177);
    uVar108 = auVar38._0_4_;
    auVar128._4_4_ = uVar108;
    auVar128._0_4_ = uVar108;
    auVar128._8_4_ = uVar108;
    auVar128._12_4_ = uVar108;
    auVar128._16_4_ = uVar108;
    auVar128._20_4_ = uVar108;
    auVar128._24_4_ = uVar108;
    auVar128._28_4_ = uVar108;
    auVar192._8_4_ = 1;
    auVar192._0_8_ = 0x100000001;
    auVar192._12_4_ = 1;
    auVar192._16_4_ = 1;
    auVar192._20_4_ = 1;
    auVar192._24_4_ = 1;
    auVar192._28_4_ = 1;
    auVar67 = ZEXT1632(auVar38);
    auVar66 = vpermps_avx2(auVar192,auVar67);
    auVar75 = vbroadcastss_avx512vl(auVar47);
    auVar82 = ZEXT1632(auVar47);
    auVar76 = vpermps_avx512vl(auVar192,auVar82);
    auVar77 = vbroadcastss_avx512vl(auVar48);
    auVar84 = ZEXT1632(auVar48);
    auVar64 = vpermps_avx512vl(auVar192,auVar84);
    auVar65 = vbroadcastss_avx512vl(auVar39);
    auVar80 = ZEXT1632(auVar39);
    auVar78 = vpermps_avx512vl(auVar192,auVar80);
    auVar193._4_4_ = fVar210;
    auVar193._0_4_ = fVar210;
    auVar193._8_4_ = fVar210;
    auVar193._12_4_ = fVar210;
    auVar193._16_4_ = fVar210;
    auVar193._20_4_ = fVar210;
    auVar193._24_4_ = fVar210;
    auVar193._28_4_ = fVar210;
    auVar235._8_4_ = 2;
    auVar235._0_8_ = 0x200000002;
    auVar235._12_4_ = 2;
    auVar235._16_4_ = 2;
    auVar235._20_4_ = 2;
    auVar235._24_4_ = 2;
    auVar235._28_4_ = 2;
    auVar62 = vpermps_avx512vl(auVar235,auVar67);
    auVar161._8_4_ = 3;
    auVar161._0_8_ = 0x300000003;
    auVar161._12_4_ = 3;
    auVar161._16_4_ = 3;
    auVar161._20_4_ = 3;
    auVar161._24_4_ = 3;
    auVar161._28_4_ = 3;
    auVar63 = vpermps_avx512vl(auVar161,auVar67);
    auVar67 = vpermps_avx2(auVar235,auVar82);
    auVar82 = vpermps_avx2(auVar161,auVar82);
    auVar83 = vpermps_avx2(auVar235,auVar84);
    auVar84 = vpermps_avx2(auVar161,auVar84);
    auVar79 = vpermps_avx512vl(auVar235,auVar80);
    auVar80 = vpermps_avx512vl(auVar161,auVar80);
    auVar37 = vfmadd132ps_fma(auVar68,auVar177,_DAT_02020f20);
    auVar74 = vsubps_avx512vl(auVar74,ZEXT1632(auVar37));
    auVar68 = vmulps_avx512vl(auVar75,ZEXT1632(auVar37));
    auVar85 = ZEXT1632(auVar37);
    auVar81 = vmulps_avx512vl(auVar76,auVar85);
    auVar38 = vfmadd231ps_fma(auVar68,auVar74,auVar128);
    auVar39 = vfmadd231ps_fma(auVar81,auVar74,auVar66);
    auVar68 = vmulps_avx512vl(auVar77,auVar85);
    auVar81 = vmulps_avx512vl(auVar64,auVar85);
    auVar68 = vfmadd231ps_avx512vl(auVar68,auVar74,auVar75);
    auVar75 = vfmadd231ps_avx512vl(auVar81,auVar74,auVar76);
    auVar76 = vmulps_avx512vl(auVar65,auVar85);
    auVar81 = ZEXT1632(auVar37);
    auVar78 = vmulps_avx512vl(auVar78,auVar81);
    auVar76 = vfmadd231ps_avx512vl(auVar76,auVar74,auVar77);
    auVar77 = vfmadd231ps_avx512vl(auVar78,auVar74,auVar64);
    fVar206 = auVar37._0_4_;
    fVar207 = auVar37._4_4_;
    auVar15._4_4_ = fVar207 * auVar68._4_4_;
    auVar15._0_4_ = fVar206 * auVar68._0_4_;
    fVar208 = auVar37._8_4_;
    auVar15._8_4_ = fVar208 * auVar68._8_4_;
    fVar209 = auVar37._12_4_;
    auVar15._12_4_ = fVar209 * auVar68._12_4_;
    auVar15._16_4_ = auVar68._16_4_ * 0.0;
    auVar15._20_4_ = auVar68._20_4_ * 0.0;
    auVar15._24_4_ = auVar68._24_4_ * 0.0;
    auVar15._28_4_ = fVar195;
    auVar16._4_4_ = fVar207 * auVar75._4_4_;
    auVar16._0_4_ = fVar206 * auVar75._0_4_;
    auVar16._8_4_ = fVar208 * auVar75._8_4_;
    auVar16._12_4_ = fVar209 * auVar75._12_4_;
    auVar16._16_4_ = auVar75._16_4_ * 0.0;
    auVar16._20_4_ = auVar75._20_4_ * 0.0;
    auVar16._24_4_ = auVar75._24_4_ * 0.0;
    auVar16._28_4_ = auVar66._28_4_;
    auVar38 = vfmadd231ps_fma(auVar15,auVar74,ZEXT1632(auVar38));
    auVar39 = vfmadd231ps_fma(auVar16,auVar74,ZEXT1632(auVar39));
    auVar116._0_4_ = fVar206 * auVar76._0_4_;
    auVar116._4_4_ = fVar207 * auVar76._4_4_;
    auVar116._8_4_ = fVar208 * auVar76._8_4_;
    auVar116._12_4_ = fVar209 * auVar76._12_4_;
    auVar116._16_4_ = auVar76._16_4_ * 0.0;
    auVar116._20_4_ = auVar76._20_4_ * 0.0;
    auVar116._24_4_ = auVar76._24_4_ * 0.0;
    auVar116._28_4_ = 0;
    auVar17._4_4_ = fVar207 * auVar77._4_4_;
    auVar17._0_4_ = fVar206 * auVar77._0_4_;
    auVar17._8_4_ = fVar208 * auVar77._8_4_;
    auVar17._12_4_ = fVar209 * auVar77._12_4_;
    auVar17._16_4_ = auVar77._16_4_ * 0.0;
    auVar17._20_4_ = auVar77._20_4_ * 0.0;
    auVar17._24_4_ = auVar77._24_4_ * 0.0;
    auVar17._28_4_ = auVar76._28_4_;
    auVar47 = vfmadd231ps_fma(auVar116,auVar74,auVar68);
    auVar48 = vfmadd231ps_fma(auVar17,auVar74,auVar75);
    auVar18._28_4_ = auVar75._28_4_;
    auVar18._0_28_ =
         ZEXT1628(CONCAT412(fVar209 * auVar48._12_4_,
                            CONCAT48(fVar208 * auVar48._8_4_,
                                     CONCAT44(fVar207 * auVar48._4_4_,fVar206 * auVar48._0_4_))));
    auVar131 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar209 * auVar47._12_4_,
                                                  CONCAT48(fVar208 * auVar47._8_4_,
                                                           CONCAT44(fVar207 * auVar47._4_4_,
                                                                    fVar206 * auVar47._0_4_)))),
                               auVar74,ZEXT1632(auVar38));
    auVar52 = vfmadd231ps_fma(auVar18,auVar74,ZEXT1632(auVar39));
    auVar68 = vsubps_avx(ZEXT1632(auVar47),ZEXT1632(auVar38));
    auVar66 = vsubps_avx(ZEXT1632(auVar48),ZEXT1632(auVar39));
    auVar75 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar68 = vmulps_avx512vl(auVar68,auVar75);
    auVar66 = vmulps_avx512vl(auVar66,auVar75);
    auVar186._0_4_ = fVar210 * auVar68._0_4_;
    auVar186._4_4_ = fVar210 * auVar68._4_4_;
    auVar186._8_4_ = fVar210 * auVar68._8_4_;
    auVar186._12_4_ = fVar210 * auVar68._12_4_;
    auVar186._16_4_ = fVar210 * auVar68._16_4_;
    auVar186._20_4_ = fVar210 * auVar68._20_4_;
    auVar186._24_4_ = fVar210 * auVar68._24_4_;
    auVar186._28_4_ = 0;
    auVar68 = vmulps_avx512vl(auVar193,auVar66);
    auVar47 = vxorps_avx512vl(auVar65._0_16_,auVar65._0_16_);
    auVar76 = vpermt2ps_avx512vl(ZEXT1632(auVar131),_DAT_0205fd20,ZEXT1632(auVar47));
    auVar77 = vpermt2ps_avx512vl(ZEXT1632(auVar52),_DAT_0205fd20,ZEXT1632(auVar47));
    auVar117._0_4_ = auVar186._0_4_ + auVar131._0_4_;
    auVar117._4_4_ = auVar186._4_4_ + auVar131._4_4_;
    auVar117._8_4_ = auVar186._8_4_ + auVar131._8_4_;
    auVar117._12_4_ = auVar186._12_4_ + auVar131._12_4_;
    auVar117._16_4_ = auVar186._16_4_ + 0.0;
    auVar117._20_4_ = auVar186._20_4_ + 0.0;
    auVar117._24_4_ = auVar186._24_4_ + 0.0;
    auVar117._28_4_ = 0;
    auVar85 = ZEXT1632(auVar47);
    auVar66 = vpermt2ps_avx512vl(auVar186,_DAT_0205fd20,auVar85);
    auVar64 = vaddps_avx512vl(ZEXT1632(auVar52),auVar68);
    auVar65 = vpermt2ps_avx512vl(auVar68,_DAT_0205fd20,auVar85);
    auVar68 = vsubps_avx(auVar76,auVar66);
    auVar65 = vsubps_avx512vl(auVar77,auVar65);
    auVar66 = vmulps_avx512vl(auVar67,auVar81);
    auVar78 = vmulps_avx512vl(auVar82,auVar81);
    auVar66 = vfmadd231ps_avx512vl(auVar66,auVar74,auVar62);
    auVar78 = vfmadd231ps_avx512vl(auVar78,auVar74,auVar63);
    auVar62 = vmulps_avx512vl(auVar83,auVar81);
    auVar63 = vmulps_avx512vl(auVar84,auVar81);
    auVar67 = vfmadd231ps_avx512vl(auVar62,auVar74,auVar67);
    auVar82 = vfmadd231ps_avx512vl(auVar63,auVar74,auVar82);
    auVar62 = vmulps_avx512vl(auVar79,auVar81);
    auVar63 = vmulps_avx512vl(auVar80,auVar81);
    auVar38 = vfmadd231ps_fma(auVar62,auVar74,auVar83);
    auVar39 = vfmadd231ps_fma(auVar63,auVar74,auVar84);
    auVar62 = vmulps_avx512vl(auVar81,auVar67);
    auVar63 = vmulps_avx512vl(ZEXT1632(auVar37),auVar82);
    auVar66 = vfmadd231ps_avx512vl(auVar62,auVar74,auVar66);
    auVar78 = vfmadd231ps_avx512vl(auVar63,auVar74,auVar78);
    auVar67 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar209 * auVar38._12_4_,
                                            CONCAT48(fVar208 * auVar38._8_4_,
                                                     CONCAT44(fVar207 * auVar38._4_4_,
                                                              fVar206 * auVar38._0_4_)))),auVar74,
                         auVar67);
    auVar82 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar209 * auVar39._12_4_,
                                            CONCAT48(fVar208 * auVar39._8_4_,
                                                     CONCAT44(fVar207 * auVar39._4_4_,
                                                              fVar206 * auVar39._0_4_)))),auVar74,
                         auVar82);
    auVar19._4_4_ = fVar207 * auVar67._4_4_;
    auVar19._0_4_ = fVar206 * auVar67._0_4_;
    auVar19._8_4_ = fVar208 * auVar67._8_4_;
    auVar19._12_4_ = fVar209 * auVar67._12_4_;
    auVar19._16_4_ = auVar67._16_4_ * 0.0;
    auVar19._20_4_ = auVar67._20_4_ * 0.0;
    auVar19._24_4_ = auVar67._24_4_ * 0.0;
    auVar19._28_4_ = auVar84._28_4_;
    auVar20._4_4_ = fVar207 * auVar82._4_4_;
    auVar20._0_4_ = fVar206 * auVar82._0_4_;
    auVar20._8_4_ = fVar208 * auVar82._8_4_;
    auVar20._12_4_ = fVar209 * auVar82._12_4_;
    auVar20._16_4_ = auVar82._16_4_ * 0.0;
    auVar20._20_4_ = auVar82._20_4_ * 0.0;
    auVar20._24_4_ = auVar82._24_4_ * 0.0;
    auVar20._28_4_ = auVar83._28_4_;
    auVar83 = vfmadd231ps_avx512vl(auVar19,auVar74,auVar66);
    auVar84 = vfmadd231ps_avx512vl(auVar20,auVar78,auVar74);
    auVar66 = vsubps_avx512vl(auVar67,auVar66);
    auVar67 = vsubps_avx512vl(auVar82,auVar78);
    auVar66 = vmulps_avx512vl(auVar66,auVar75);
    auVar67 = vmulps_avx512vl(auVar67,auVar75);
    fVar195 = fVar210 * auVar66._0_4_;
    fVar206 = fVar210 * auVar66._4_4_;
    auVar21._4_4_ = fVar206;
    auVar21._0_4_ = fVar195;
    fVar207 = fVar210 * auVar66._8_4_;
    auVar21._8_4_ = fVar207;
    fVar208 = fVar210 * auVar66._12_4_;
    auVar21._12_4_ = fVar208;
    fVar209 = fVar210 * auVar66._16_4_;
    auVar21._16_4_ = fVar209;
    fVar211 = fVar210 * auVar66._20_4_;
    auVar21._20_4_ = fVar211;
    fVar210 = fVar210 * auVar66._24_4_;
    auVar21._24_4_ = fVar210;
    auVar21._28_4_ = auVar66._28_4_;
    auVar67 = vmulps_avx512vl(auVar193,auVar67);
    auVar82 = vpermt2ps_avx512vl(auVar83,_DAT_0205fd20,auVar85);
    auVar74 = vpermt2ps_avx512vl(auVar84,_DAT_0205fd20,auVar85);
    auVar194._0_4_ = auVar83._0_4_ + fVar195;
    auVar194._4_4_ = auVar83._4_4_ + fVar206;
    auVar194._8_4_ = auVar83._8_4_ + fVar207;
    auVar194._12_4_ = auVar83._12_4_ + fVar208;
    auVar194._16_4_ = auVar83._16_4_ + fVar209;
    auVar194._20_4_ = auVar83._20_4_ + fVar211;
    auVar194._24_4_ = auVar83._24_4_ + fVar210;
    auVar194._28_4_ = auVar83._28_4_ + auVar66._28_4_;
    auVar66 = vpermt2ps_avx512vl(auVar21,_DAT_0205fd20,ZEXT1632(auVar47));
    auVar75 = vaddps_avx512vl(auVar84,auVar67);
    auVar67 = vpermt2ps_avx512vl(auVar67,_DAT_0205fd20,ZEXT1632(auVar47));
    auVar66 = vsubps_avx(auVar82,auVar66);
    auVar67 = vsubps_avx512vl(auVar74,auVar67);
    auVar139 = ZEXT1632(auVar131);
    auVar78 = vsubps_avx512vl(auVar83,auVar139);
    auVar146 = ZEXT1632(auVar52);
    auVar62 = vsubps_avx512vl(auVar84,auVar146);
    auVar63 = vsubps_avx512vl(auVar82,auVar76);
    auVar78 = vaddps_avx512vl(auVar78,auVar63);
    auVar63 = vsubps_avx512vl(auVar74,auVar77);
    auVar62 = vaddps_avx512vl(auVar62,auVar63);
    auVar63 = vmulps_avx512vl(auVar146,auVar78);
    auVar63 = vfnmadd231ps_avx512vl(auVar63,auVar139,auVar62);
    auVar79 = vmulps_avx512vl(auVar64,auVar78);
    auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar117,auVar62);
    auVar80 = vmulps_avx512vl(auVar65,auVar78);
    auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar68,auVar62);
    auVar81 = vmulps_avx512vl(auVar77,auVar78);
    auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar76,auVar62);
    auVar85 = vmulps_avx512vl(auVar84,auVar78);
    auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar83,auVar62);
    auVar86 = vmulps_avx512vl(auVar75,auVar78);
    auVar86 = vfnmadd231ps_avx512vl(auVar86,auVar194,auVar62);
    auVar87 = vmulps_avx512vl(auVar67,auVar78);
    auVar87 = vfnmadd231ps_avx512vl(auVar87,auVar66,auVar62);
    auVar78 = vmulps_avx512vl(auVar74,auVar78);
    auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar82,auVar62);
    auVar62 = vminps_avx512vl(auVar63,auVar79);
    auVar63 = vmaxps_avx512vl(auVar63,auVar79);
    auVar79 = vminps_avx512vl(auVar80,auVar81);
    auVar62 = vminps_avx512vl(auVar62,auVar79);
    auVar79 = vmaxps_avx512vl(auVar80,auVar81);
    auVar63 = vmaxps_avx512vl(auVar63,auVar79);
    auVar79 = vminps_avx512vl(auVar85,auVar86);
    auVar80 = vmaxps_avx512vl(auVar85,auVar86);
    auVar81 = vminps_avx512vl(auVar87,auVar78);
    auVar79 = vminps_avx512vl(auVar79,auVar81);
    auVar62 = vminps_avx512vl(auVar62,auVar79);
    auVar78 = vmaxps_avx512vl(auVar87,auVar78);
    auVar78 = vmaxps_avx512vl(auVar80,auVar78);
    auVar78 = vmaxps_avx512vl(auVar63,auVar78);
    uVar10 = vcmpps_avx512vl(auVar62,local_1c0,2);
    uVar12 = vcmpps_avx512vl(auVar78,local_1e0,5);
    uVar28 = 0;
    bVar24 = (byte)uVar10 & (byte)uVar12 & 0x7f;
    if (bVar24 != 0) {
      auVar78 = vsubps_avx512vl(auVar76,auVar139);
      auVar62 = vsubps_avx512vl(auVar77,auVar146);
      auVar63 = vsubps_avx512vl(auVar82,auVar83);
      auVar78 = vaddps_avx512vl(auVar78,auVar63);
      auVar63 = vsubps_avx512vl(auVar74,auVar84);
      auVar62 = vaddps_avx512vl(auVar62,auVar63);
      auVar63 = vmulps_avx512vl(auVar146,auVar78);
      auVar63 = vfnmadd231ps_avx512vl(auVar63,auVar62,auVar139);
      auVar64 = vmulps_avx512vl(auVar64,auVar78);
      auVar64 = vfnmadd213ps_avx512vl(auVar117,auVar62,auVar64);
      auVar65 = vmulps_avx512vl(auVar65,auVar78);
      auVar65 = vfnmadd213ps_avx512vl(auVar68,auVar62,auVar65);
      auVar68 = vmulps_avx512vl(auVar77,auVar78);
      auVar76 = vfnmadd231ps_avx512vl(auVar68,auVar62,auVar76);
      auVar68 = vmulps_avx512vl(auVar84,auVar78);
      auVar83 = vfnmadd231ps_avx512vl(auVar68,auVar62,auVar83);
      auVar68 = vmulps_avx512vl(auVar75,auVar78);
      auVar84 = vfnmadd213ps_avx512vl(auVar194,auVar62,auVar68);
      auVar68 = vmulps_avx512vl(auVar67,auVar78);
      auVar75 = vfnmadd213ps_avx512vl(auVar66,auVar62,auVar68);
      auVar68 = vmulps_avx512vl(auVar74,auVar78);
      auVar74 = vfnmadd231ps_avx512vl(auVar68,auVar82,auVar62);
      auVar66 = vminps_avx(auVar63,auVar64);
      auVar68 = vmaxps_avx(auVar63,auVar64);
      auVar67 = vminps_avx(auVar65,auVar76);
      auVar67 = vminps_avx(auVar66,auVar67);
      auVar66 = vmaxps_avx(auVar65,auVar76);
      auVar68 = vmaxps_avx(auVar68,auVar66);
      auVar82 = vminps_avx(auVar83,auVar84);
      auVar66 = vmaxps_avx(auVar83,auVar84);
      auVar83 = vminps_avx(auVar75,auVar74);
      auVar82 = vminps_avx(auVar82,auVar83);
      auVar82 = vminps_avx(auVar67,auVar82);
      auVar67 = vmaxps_avx(auVar75,auVar74);
      auVar66 = vmaxps_avx(auVar66,auVar67);
      auVar68 = vmaxps_avx(auVar68,auVar66);
      uVar10 = vcmpps_avx512vl(auVar68,local_1e0,5);
      uVar12 = vcmpps_avx512vl(auVar82,local_1c0,2);
      uVar28 = (uint)(bVar24 & (byte)uVar10 & (byte)uVar12);
    }
    if (uVar28 != 0) {
      auStack_420[uVar26] = uVar28;
      uVar10 = vmovlps_avx(auVar36);
      *(undefined8 *)(&uStack_280 + uVar26 * 2) = uVar10;
      uVar31 = vmovlps_avx512f(auVar49);
      auStack_1a0[uVar26] = uVar31;
      uVar26 = (ulong)((int)uVar26 + 1);
    }
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar244 = ZEXT1664(auVar36);
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar245 = ZEXT1664(auVar36);
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar246 = ZEXT1664(auVar36);
    auVar68 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar247 = ZEXT3264(auVar68);
    auVar248 = ZEXT464(0x3f800000);
    auVar88._16_16_ = auVar68._16_16_;
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar249 = ZEXT1664(auVar36);
    auVar69 = auVar88;
    do {
      auVar38 = auVar252._0_16_;
      auVar36 = auVar244._0_16_;
      auVar37 = auVar249._0_16_;
      if ((int)uVar26 == 0) {
        if (bVar34) {
          return local_5a1;
        }
        uVar108 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar14._4_4_ = uVar108;
        auVar14._0_4_ = uVar108;
        auVar14._8_4_ = uVar108;
        auVar14._12_4_ = uVar108;
        auVar14._16_4_ = uVar108;
        auVar14._20_4_ = uVar108;
        auVar14._24_4_ = uVar108;
        auVar14._28_4_ = uVar108;
        uVar10 = vcmpps_avx512vl(local_200,auVar14,2);
        uVar32 = (uint)uVar33 & (uint)uVar10;
        uVar33 = (ulong)uVar32;
        local_5a1 = uVar32 != 0;
        if (!local_5a1) {
          return local_5a1;
        }
        goto LAB_01d31e7f;
      }
      uVar25 = (int)uVar26 - 1;
      uVar27 = (ulong)uVar25;
      uVar28 = (&uStack_280)[uVar27 * 2];
      fVar210 = afStack_27c[uVar27 * 2];
      uVar5 = auStack_420[uVar27];
      auVar241._8_8_ = 0;
      auVar241._0_8_ = auStack_1a0[uVar27];
      auVar243 = ZEXT1664(auVar241);
      lVar30 = 0;
      for (uVar31 = (ulong)uVar5; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
        lVar30 = lVar30 + 1;
      }
      uVar29 = uVar5 - 1 & uVar5;
      auStack_420[uVar27] = uVar29;
      if (uVar29 == 0) {
        uVar26 = (ulong)uVar25;
      }
      auVar122._0_4_ = (float)lVar30;
      auVar122._4_8_ = SUB128(ZEXT812(0),4);
      auVar122._12_4_ = 0;
      auVar39 = vmulss_avx512f(auVar122,SUB6416(ZEXT464(0x3e124925),0));
      lVar30 = lVar30 + 1;
      auVar133._0_4_ = (float)lVar30;
      auVar133._4_8_ = SUB128(ZEXT812(0),4);
      auVar133._12_4_ = 0;
      auVar47 = vmulss_avx512f(auVar133,SUB6416(ZEXT464(0x3e124925),0));
      auVar131 = auVar248._0_16_;
      auVar48 = vsubss_avx512f(auVar131,auVar39);
      auVar39 = vmulss_avx512f(ZEXT416((uint)fVar210),auVar39);
      auVar102._0_16_ = vfmadd231ss_avx512f(auVar39,ZEXT416(uVar28),auVar48);
      auVar39 = vsubss_avx512f(auVar131,auVar47);
      auVar39 = vfmadd231ss_fma(ZEXT416((uint)(fVar210 * auVar47._0_4_)),ZEXT416(uVar28),auVar39);
      auVar47 = vsubss_avx512f(auVar39,auVar102._0_16_);
      vucomiss_avx512f(auVar47);
      if (uVar5 == 0 || lVar30 == 0) break;
      auVar48 = vshufps_avx(auVar241,auVar241,0x50);
      vucomiss_avx512f(auVar47);
      auVar49 = vsubps_avx512vl(auVar37,auVar48);
      fVar210 = auVar48._0_4_;
      auVar134._0_4_ = fVar221 * fVar210;
      fVar195 = auVar48._4_4_;
      auVar134._4_4_ = fVar222 * fVar195;
      fVar206 = auVar48._8_4_;
      auVar134._8_4_ = fVar221 * fVar206;
      fVar207 = auVar48._12_4_;
      auVar134._12_4_ = fVar222 * fVar207;
      auVar143._0_4_ = fVar106 * fVar210;
      auVar143._4_4_ = fVar107 * fVar195;
      auVar143._8_4_ = fVar106 * fVar206;
      auVar143._12_4_ = fVar107 * fVar207;
      auVar151._0_4_ = fVar130 * fVar210;
      auVar151._4_4_ = fVar149 * fVar195;
      auVar151._8_4_ = fVar130 * fVar206;
      auVar151._12_4_ = fVar149 * fVar207;
      auVar111._0_4_ = fVar219 * fVar210;
      auVar111._4_4_ = fVar220 * fVar195;
      auVar111._8_4_ = fVar219 * fVar206;
      auVar111._12_4_ = fVar220 * fVar207;
      auVar48 = vfmadd231ps_fma(auVar134,auVar49,auVar166);
      auVar52 = vfmadd231ps_fma(auVar143,auVar49,auVar46);
      auVar50 = vfmadd231ps_avx512vl(auVar151,auVar49,auVar109);
      auVar49 = vfmadd231ps_fma(auVar111,auVar121,auVar49);
      auVar129._16_16_ = auVar48;
      auVar129._0_16_ = auVar48;
      auVar140._16_16_ = auVar52;
      auVar140._0_16_ = auVar52;
      auVar147._16_16_ = auVar50;
      auVar147._0_16_ = auVar50;
      auVar162._0_4_ = auVar102._0_4_;
      auVar162._4_4_ = auVar162._0_4_;
      auVar162._8_4_ = auVar162._0_4_;
      auVar162._12_4_ = auVar162._0_4_;
      uVar108 = auVar39._0_4_;
      auVar162._20_4_ = uVar108;
      auVar162._16_4_ = uVar108;
      auVar162._24_4_ = uVar108;
      auVar162._28_4_ = uVar108;
      auVar68 = vsubps_avx(auVar140,auVar129);
      auVar52 = vfmadd213ps_fma(auVar68,auVar162,auVar129);
      auVar68 = vsubps_avx(auVar147,auVar140);
      auVar51 = vfmadd213ps_fma(auVar68,auVar162,auVar140);
      auVar48 = vsubps_avx(auVar49,auVar50);
      auVar141._16_16_ = auVar48;
      auVar141._0_16_ = auVar48;
      auVar48 = vfmadd213ps_fma(auVar141,auVar162,auVar147);
      auVar68 = vsubps_avx(ZEXT1632(auVar51),ZEXT1632(auVar52));
      auVar52 = vfmadd213ps_fma(auVar68,auVar162,ZEXT1632(auVar52));
      auVar68 = vsubps_avx(ZEXT1632(auVar48),ZEXT1632(auVar51));
      auVar48 = vfmadd213ps_fma(auVar68,auVar162,ZEXT1632(auVar51));
      auVar68 = vsubps_avx(ZEXT1632(auVar48),ZEXT1632(auVar52));
      auVar57 = vfmadd231ps_fma(ZEXT1632(auVar52),auVar68,auVar162);
      auVar68 = vmulps_avx512vl(auVar68,auVar247._0_32_);
      auVar163 = auVar68._16_16_;
      fVar210 = auVar47._0_4_ * 0.33333334;
      auVar152._0_8_ =
           CONCAT44(auVar57._4_4_ + fVar210 * auVar68._4_4_,auVar57._0_4_ + fVar210 * auVar68._0_4_)
      ;
      auVar152._8_4_ = auVar57._8_4_ + fVar210 * auVar68._8_4_;
      auVar152._12_4_ = auVar57._12_4_ + fVar210 * auVar68._12_4_;
      auVar135._0_4_ = fVar210 * auVar68._16_4_;
      auVar135._4_4_ = fVar210 * auVar68._20_4_;
      auVar135._8_4_ = fVar210 * auVar68._24_4_;
      auVar135._12_4_ = fVar210 * auVar68._28_4_;
      auVar157 = vsubps_avx((undefined1  [16])0x0,auVar135);
      auVar60 = vshufpd_avx(auVar57,auVar57,3);
      auVar58 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar48 = vsubps_avx(auVar60,auVar57);
      auVar52 = vsubps_avx(auVar58,(undefined1  [16])0x0);
      auVar167._0_4_ = auVar52._0_4_ + auVar48._0_4_;
      auVar167._4_4_ = auVar52._4_4_ + auVar48._4_4_;
      auVar167._8_4_ = auVar52._8_4_ + auVar48._8_4_;
      auVar167._12_4_ = auVar52._12_4_ + auVar48._12_4_;
      auVar48 = vshufps_avx(auVar57,auVar57,0xb1);
      auVar52 = vshufps_avx(auVar152,auVar152,0xb1);
      auVar49 = vshufps_avx(auVar157,auVar157,0xb1);
      auVar51 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar224._4_4_ = auVar167._0_4_;
      auVar224._0_4_ = auVar167._0_4_;
      auVar224._8_4_ = auVar167._0_4_;
      auVar224._12_4_ = auVar167._0_4_;
      auVar50 = vshufps_avx(auVar167,auVar167,0x55);
      fVar210 = auVar50._0_4_;
      auVar180._0_4_ = auVar48._0_4_ * fVar210;
      fVar195 = auVar50._4_4_;
      auVar180._4_4_ = auVar48._4_4_ * fVar195;
      fVar206 = auVar50._8_4_;
      auVar180._8_4_ = auVar48._8_4_ * fVar206;
      fVar207 = auVar50._12_4_;
      auVar180._12_4_ = auVar48._12_4_ * fVar207;
      auVar189._0_4_ = auVar52._0_4_ * fVar210;
      auVar189._4_4_ = auVar52._4_4_ * fVar195;
      auVar189._8_4_ = auVar52._8_4_ * fVar206;
      auVar189._12_4_ = auVar52._12_4_ * fVar207;
      auVar198._0_4_ = auVar49._0_4_ * fVar210;
      auVar198._4_4_ = auVar49._4_4_ * fVar195;
      auVar198._8_4_ = auVar49._8_4_ * fVar206;
      auVar198._12_4_ = auVar49._12_4_ * fVar207;
      auVar168._0_4_ = auVar51._0_4_ * fVar210;
      auVar168._4_4_ = auVar51._4_4_ * fVar195;
      auVar168._8_4_ = auVar51._8_4_ * fVar206;
      auVar168._12_4_ = auVar51._12_4_ * fVar207;
      auVar48 = vfmadd231ps_fma(auVar180,auVar224,auVar57);
      auVar52 = vfmadd231ps_fma(auVar189,auVar224,auVar152);
      auVar50 = vfmadd231ps_fma(auVar198,auVar224,auVar157);
      auVar56 = vfmadd231ps_fma(auVar168,(undefined1  [16])0x0,auVar224);
      auVar59 = vshufpd_avx(auVar48,auVar48,1);
      auVar53 = vshufpd_avx(auVar52,auVar52,1);
      auVar54 = vshufpd_avx(auVar50,auVar50,1);
      auVar55 = vshufpd_avx(auVar56,auVar56,1);
      auVar49 = vminss_avx(auVar48,auVar52);
      auVar48 = vmaxss_avx(auVar52,auVar48);
      auVar51 = vminss_avx(auVar50,auVar56);
      auVar52 = vmaxss_avx(auVar56,auVar50);
      auVar51 = vminss_avx(auVar49,auVar51);
      auVar48 = vmaxss_avx(auVar52,auVar48);
      auVar50 = vminss_avx(auVar59,auVar53);
      auVar52 = vmaxss_avx(auVar53,auVar59);
      auVar59 = vminss_avx(auVar54,auVar55);
      auVar49 = vmaxss_avx(auVar55,auVar54);
      auVar50 = vminss_avx(auVar50,auVar59);
      auVar52 = vmaxss_avx(auVar49,auVar52);
      fVar206 = auVar51._0_4_;
      fVar195 = auVar52._0_4_;
      fVar210 = auVar48._0_4_;
      if ((0.0001 <= fVar206) || (fVar195 <= -0.0001)) {
        uVar10 = vcmpps_avx512vl(auVar50,SUB6416(ZEXT464(0x38d1b717),0),1);
        uVar12 = vcmpps_avx512vl(auVar51,SUB6416(ZEXT464(0x38d1b717),0),1);
        if ((-0.0001 < fVar210 & ((byte)uVar12 | (byte)uVar10)) != 0) goto LAB_01d32dc9;
        uVar10 = vcmpps_avx512vl(SUB6416(ZEXT464(0xb8d1b717),0),auVar52,5);
        uVar12 = vcmpps_avx512vl(auVar50,SUB6416(ZEXT464(0x38d1b717),0),5);
        if ((((ushort)uVar12 | (ushort)uVar10) & 1) == 0) goto LAB_01d32dc9;
        bVar11 = true;
        auVar243 = ZEXT1664(auVar241);
        auVar69._16_16_ = auVar163;
        auVar69._0_16_ = auVar102._0_16_;
      }
      else {
LAB_01d32dc9:
        auVar53 = auVar251._0_16_;
        uVar10 = vcmpss_avx512f(auVar51,auVar53,1);
        bVar11 = (bool)((byte)uVar10 & 1);
        iVar103 = auVar248._0_4_;
        fVar207 = (float)((uint)bVar11 * -0x40800000 + (uint)!bVar11 * iVar103);
        uVar10 = vcmpss_avx512f(auVar48,auVar53,1);
        bVar11 = (bool)((byte)uVar10 & 1);
        fVar208 = (float)((uint)bVar11 * -0x40800000 + (uint)!bVar11 * iVar103);
        bVar11 = fVar207 != fVar208;
        iVar250 = auVar251._0_4_;
        auVar90._16_16_ = auVar163;
        auVar90._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar89._4_28_ = auVar90._4_28_;
        auVar89._0_4_ = (uint)bVar11 * iVar250 + (uint)!bVar11 * 0x7f800000;
        auVar59 = auVar89._0_16_;
        auVar92._16_16_ = auVar163;
        auVar92._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar91._4_28_ = auVar92._4_28_;
        auVar91._0_4_ = (uint)bVar11 * iVar250 + (uint)!bVar11 * -0x800000;
        auVar49 = auVar91._0_16_;
        uVar10 = vcmpss_avx512f(auVar50,auVar53,1);
        bVar11 = (bool)((byte)uVar10 & 1);
        fVar209 = (float)((uint)bVar11 * -0x40800000 + (uint)!bVar11 * iVar103);
        if ((fVar207 != fVar209) || (NAN(fVar207) || NAN(fVar209))) {
          fVar207 = auVar50._0_4_;
          bVar11 = fVar207 == fVar206;
          if ((!bVar11) || (NAN(fVar207) || NAN(fVar206))) {
            auVar51 = vxorps_avx512vl(auVar51,auVar246._0_16_);
            auVar236._0_4_ = auVar51._0_4_ / (fVar207 - fVar206);
            auVar236._4_12_ = auVar51._4_12_;
            auVar51 = vsubss_avx512f(auVar131,auVar236);
            auVar50 = vfmadd213ss_avx512f(auVar51,auVar53,auVar236);
            auVar51 = auVar50;
          }
          else {
            vucomiss_avx512f(auVar53);
            auVar94._16_16_ = auVar163;
            auVar94._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar93._4_28_ = auVar94._4_28_;
            auVar93._0_4_ = (uint)bVar11 * iVar250 + (uint)!bVar11 * 0x7f800000;
            auVar50 = auVar93._0_16_;
            auVar51 = ZEXT416((uint)bVar11 * 0x3f800000 + (uint)!bVar11 * -0x800000);
          }
          auVar59 = vminss_avx(auVar59,auVar50);
          auVar49 = vmaxss_avx(auVar51,auVar49);
        }
        uVar10 = vcmpss_avx512f(auVar52,auVar53,1);
        bVar11 = (bool)((byte)uVar10 & 1);
        fVar206 = (float)((uint)bVar11 * -0x40800000 + (uint)!bVar11 * iVar103);
        if ((fVar208 != fVar206) || (NAN(fVar208) || NAN(fVar206))) {
          bVar11 = fVar195 == fVar210;
          if ((!bVar11) || (NAN(fVar195) || NAN(fVar210))) {
            auVar48 = vxorps_avx512vl(auVar48,auVar246._0_16_);
            auVar199._0_4_ = auVar48._0_4_ / (fVar195 - fVar210);
            auVar199._4_12_ = auVar48._4_12_;
            auVar48 = vsubss_avx512f(auVar131,auVar199);
            auVar52 = vfmadd213ss_avx512f(auVar48,auVar53,auVar199);
            auVar48 = auVar52;
          }
          else {
            vucomiss_avx512f(auVar53);
            auVar96._16_16_ = auVar163;
            auVar96._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar95._4_28_ = auVar96._4_28_;
            auVar95._0_4_ = (uint)bVar11 * iVar250 + (uint)!bVar11 * 0x7f800000;
            auVar52 = auVar95._0_16_;
            auVar48 = ZEXT416((uint)bVar11 * 0x3f800000 + (uint)!bVar11 * -0x800000);
          }
          auVar59 = vminss_avx(auVar59,auVar52);
          auVar49 = vmaxss_avx(auVar48,auVar49);
        }
        bVar11 = fVar209 != fVar206;
        auVar48 = vminss_avx512f(auVar59,auVar131);
        auVar98._16_16_ = auVar163;
        auVar98._0_16_ = auVar59;
        auVar97._4_28_ = auVar98._4_28_;
        auVar97._0_4_ = (uint)bVar11 * auVar48._0_4_ + (uint)!bVar11 * auVar59._0_4_;
        auVar48 = vmaxss_avx512f(auVar131,auVar49);
        auVar100._16_16_ = auVar163;
        auVar100._0_16_ = auVar49;
        auVar99._4_28_ = auVar100._4_28_;
        auVar99._0_4_ = (uint)bVar11 * auVar48._0_4_ + (uint)!bVar11 * auVar49._0_4_;
        auVar48 = vmaxss_avx512f(auVar53,auVar97._0_16_);
        auVar52 = vminss_avx512f(auVar99._0_16_,auVar131);
        bVar11 = true;
        if (auVar48._0_4_ <= auVar52._0_4_) {
          auVar53 = vmaxss_avx512f(auVar53,ZEXT416((uint)(auVar48._0_4_ + -0.1)));
          auVar54 = vminss_avx512f(ZEXT416((uint)(auVar52._0_4_ + 0.1)),auVar131);
          auVar112._0_8_ = auVar57._0_8_;
          auVar112._8_8_ = auVar112._0_8_;
          auVar190._8_8_ = auVar152._0_8_;
          auVar190._0_8_ = auVar152._0_8_;
          auVar200._8_8_ = auVar157._0_8_;
          auVar200._0_8_ = auVar157._0_8_;
          auVar48 = vshufpd_avx(auVar152,auVar152,3);
          auVar52 = vshufpd_avx(auVar157,auVar157,3);
          auVar49 = vshufps_avx(auVar53,auVar54,0);
          auVar55 = vsubps_avx512vl(auVar37,auVar49);
          fVar210 = auVar49._0_4_;
          auVar233._0_4_ = fVar210 * auVar60._0_4_;
          fVar195 = auVar49._4_4_;
          auVar233._4_4_ = fVar195 * auVar60._4_4_;
          fVar206 = auVar49._8_4_;
          auVar233._8_4_ = fVar206 * auVar60._8_4_;
          fVar207 = auVar49._12_4_;
          auVar233._12_4_ = fVar207 * auVar60._12_4_;
          auVar153._0_4_ = fVar210 * auVar48._0_4_;
          auVar153._4_4_ = fVar195 * auVar48._4_4_;
          auVar153._8_4_ = fVar206 * auVar48._8_4_;
          auVar153._12_4_ = fVar207 * auVar48._12_4_;
          auVar158._0_4_ = fVar210 * auVar52._0_4_;
          auVar158._4_4_ = fVar195 * auVar52._4_4_;
          auVar158._8_4_ = fVar206 * auVar52._8_4_;
          auVar158._12_4_ = fVar207 * auVar52._12_4_;
          auVar136._0_4_ = fVar210 * auVar58._0_4_;
          auVar136._4_4_ = fVar195 * auVar58._4_4_;
          auVar136._8_4_ = fVar206 * auVar58._8_4_;
          auVar136._12_4_ = fVar207 * auVar58._12_4_;
          auVar51 = vfmadd231ps_fma(auVar233,auVar55,auVar112);
          auVar50 = vfmadd231ps_fma(auVar153,auVar55,auVar190);
          auVar59 = vfmadd231ps_fma(auVar158,auVar55,auVar200);
          auVar60 = vfmadd231ps_fma(auVar136,auVar55,ZEXT816(0));
          auVar48 = vsubss_avx512f(auVar131,auVar53);
          auVar52 = vmovshdup_avx512vl(auVar241);
          auVar56 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar52._0_4_ * auVar53._0_4_)),auVar241,
                                        auVar48);
          auVar48 = vsubss_avx512f(auVar131,auVar54);
          auVar57 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar54._0_4_ * auVar52._0_4_)),auVar241,
                                        auVar48);
          auVar58 = vdivss_avx512f(auVar131,auVar47);
          auVar47 = vsubps_avx(auVar50,auVar51);
          auVar52 = vmulps_avx512vl(auVar47,auVar36);
          auVar47 = vsubps_avx(auVar59,auVar50);
          auVar49 = vmulps_avx512vl(auVar47,auVar36);
          auVar47 = vsubps_avx(auVar60,auVar59);
          auVar47 = vmulps_avx512vl(auVar47,auVar36);
          auVar48 = vminps_avx(auVar49,auVar47);
          auVar47 = vmaxps_avx(auVar49,auVar47);
          auVar48 = vminps_avx(auVar52,auVar48);
          auVar47 = vmaxps_avx(auVar52,auVar47);
          auVar52 = vshufpd_avx(auVar48,auVar48,3);
          auVar49 = vshufpd_avx(auVar47,auVar47,3);
          auVar48 = vminps_avx(auVar48,auVar52);
          auVar47 = vmaxps_avx(auVar47,auVar49);
          fVar210 = auVar58._0_4_;
          auVar181._0_4_ = fVar210 * auVar48._0_4_;
          auVar181._4_4_ = fVar210 * auVar48._4_4_;
          auVar181._8_4_ = fVar210 * auVar48._8_4_;
          auVar181._12_4_ = fVar210 * auVar48._12_4_;
          auVar169._0_4_ = fVar210 * auVar47._0_4_;
          auVar169._4_4_ = fVar210 * auVar47._4_4_;
          auVar169._8_4_ = fVar210 * auVar47._8_4_;
          auVar169._12_4_ = fVar210 * auVar47._12_4_;
          auVar58 = vdivss_avx512f(auVar131,ZEXT416((uint)(auVar57._0_4_ - auVar56._0_4_)));
          auVar47 = vshufpd_avx(auVar51,auVar51,3);
          auVar48 = vshufpd_avx(auVar50,auVar50,3);
          auVar52 = vshufpd_avx(auVar59,auVar59,3);
          auVar49 = vshufpd_avx(auVar60,auVar60,3);
          auVar47 = vsubps_avx(auVar47,auVar51);
          auVar51 = vsubps_avx(auVar48,auVar50);
          auVar50 = vsubps_avx(auVar52,auVar59);
          auVar49 = vsubps_avx(auVar49,auVar60);
          auVar48 = vminps_avx(auVar47,auVar51);
          auVar47 = vmaxps_avx(auVar47,auVar51);
          auVar52 = vminps_avx(auVar50,auVar49);
          auVar52 = vminps_avx(auVar48,auVar52);
          auVar48 = vmaxps_avx(auVar50,auVar49);
          auVar47 = vmaxps_avx(auVar47,auVar48);
          fVar210 = auVar58._0_4_;
          auVar201._0_4_ = fVar210 * auVar52._0_4_;
          auVar201._4_4_ = fVar210 * auVar52._4_4_;
          auVar201._8_4_ = fVar210 * auVar52._8_4_;
          auVar201._12_4_ = fVar210 * auVar52._12_4_;
          auVar213._0_4_ = fVar210 * auVar47._0_4_;
          auVar213._4_4_ = fVar210 * auVar47._4_4_;
          auVar213._8_4_ = fVar210 * auVar47._8_4_;
          auVar213._12_4_ = fVar210 * auVar47._12_4_;
          auVar157 = vinsertps_avx512f(auVar102._0_16_,auVar56,0x10);
          auVar51 = vinsertps_avx(auVar39,auVar57,0x10);
          auVar105._0_4_ = auVar157._0_4_ + auVar51._0_4_;
          auVar105._4_4_ = auVar157._4_4_ + auVar51._4_4_;
          auVar105._8_4_ = auVar157._8_4_ + auVar51._8_4_;
          auVar105._12_4_ = auVar157._12_4_ + auVar51._12_4_;
          auVar13._8_4_ = 0x3f000000;
          auVar13._0_8_ = 0x3f0000003f000000;
          auVar13._12_4_ = 0x3f000000;
          auVar54 = vmulps_avx512vl(auVar105,auVar13);
          auVar52 = vshufps_avx(auVar54,auVar54,0x54);
          uVar108 = auVar54._0_4_;
          auVar123._4_4_ = uVar108;
          auVar123._0_4_ = uVar108;
          auVar123._8_4_ = uVar108;
          auVar123._12_4_ = uVar108;
          auVar48 = vfmadd213ps_fma(auVar44,auVar123,auVar45);
          auVar50 = vfmadd213ps_avx512vl(auVar43,auVar123,auVar42);
          auVar49 = vfmadd213ps_fma(auVar88._0_16_,auVar123,auVar41);
          auVar47 = vsubps_avx(auVar50,auVar48);
          auVar48 = vfmadd213ps_fma(auVar47,auVar123,auVar48);
          auVar47 = vsubps_avx(auVar49,auVar50);
          auVar47 = vfmadd213ps_fma(auVar47,auVar123,auVar50);
          auVar47 = vsubps_avx(auVar47,auVar48);
          auVar48 = vfmadd231ps_fma(auVar48,auVar47,auVar123);
          auVar59 = vmulps_avx512vl(auVar47,auVar36);
          auVar225._8_8_ = auVar48._0_8_;
          auVar225._0_8_ = auVar48._0_8_;
          auVar47 = vshufpd_avx(auVar48,auVar48,3);
          auVar48 = vshufps_avx(auVar54,auVar54,0x55);
          auVar49 = vsubps_avx(auVar47,auVar225);
          auVar50 = vfmadd231ps_fma(auVar225,auVar48,auVar49);
          auVar237._8_8_ = auVar59._0_8_;
          auVar237._0_8_ = auVar59._0_8_;
          auVar47 = vshufpd_avx(auVar59,auVar59,3);
          auVar47 = vsubps_avx(auVar47,auVar237);
          auVar48 = vfmadd213ps_fma(auVar47,auVar48,auVar237);
          auVar124._0_8_ = auVar49._0_8_ ^ 0x8000000080000000;
          auVar124._8_4_ = auVar49._8_4_ ^ 0x80000000;
          auVar124._12_4_ = auVar49._12_4_ ^ 0x80000000;
          auVar47 = vmovshdup_avx(auVar48);
          auVar238._0_8_ = auVar47._0_8_ ^ 0x8000000080000000;
          auVar238._8_4_ = auVar47._8_4_ ^ 0x80000000;
          auVar238._12_4_ = auVar47._12_4_ ^ 0x80000000;
          auVar59 = vmovshdup_avx512vl(auVar49);
          auVar60 = vpermt2ps_avx512vl(auVar238,ZEXT416(5),auVar49);
          auVar47 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar47._0_4_ * auVar49._0_4_)),auVar48,
                                        auVar59);
          auVar48 = vpermt2ps_avx512vl(auVar48,SUB6416(ZEXT464(4),0),auVar124);
          auVar137._0_4_ = auVar47._0_4_;
          auVar137._4_4_ = auVar137._0_4_;
          auVar137._8_4_ = auVar137._0_4_;
          auVar137._12_4_ = auVar137._0_4_;
          auVar47 = vdivps_avx(auVar60,auVar137);
          auVar48 = vdivps_avx(auVar48,auVar137);
          fVar195 = auVar50._0_4_;
          auVar49 = vshufps_avx(auVar50,auVar50,0x55);
          fVar210 = auVar48._0_4_;
          auVar226._0_4_ = fVar195 * auVar47._0_4_ + auVar49._0_4_ * fVar210;
          auVar226._4_4_ = fVar195 * auVar47._4_4_ + auVar49._4_4_ * auVar48._4_4_;
          auVar226._8_4_ = fVar195 * auVar47._8_4_ + auVar49._8_4_ * auVar48._8_4_;
          auVar226._12_4_ = fVar195 * auVar47._12_4_ + auVar49._12_4_ * auVar48._12_4_;
          auVar55 = vsubps_avx(auVar52,auVar226);
          auVar50 = vmovshdup_avx(auVar47);
          auVar52 = vinsertps_avx(auVar181,auVar201,0x1c);
          auVar239._0_4_ = auVar50._0_4_ * auVar52._0_4_;
          auVar239._4_4_ = auVar50._4_4_ * auVar52._4_4_;
          auVar239._8_4_ = auVar50._8_4_ * auVar52._8_4_;
          auVar239._12_4_ = auVar50._12_4_ * auVar52._12_4_;
          auVar49 = vinsertps_avx(auVar169,auVar213,0x1c);
          auVar227._0_4_ = auVar50._0_4_ * auVar49._0_4_;
          auVar227._4_4_ = auVar50._4_4_ * auVar49._4_4_;
          auVar227._8_4_ = auVar50._8_4_ * auVar49._8_4_;
          auVar227._12_4_ = auVar50._12_4_ * auVar49._12_4_;
          auVar53 = vminps_avx512vl(auVar239,auVar227);
          auVar60 = vmaxps_avx(auVar227,auVar239);
          auVar58 = vmovshdup_avx(auVar48);
          auVar50 = vinsertps_avx(auVar201,auVar181,0x4c);
          auVar202._0_4_ = auVar58._0_4_ * auVar50._0_4_;
          auVar202._4_4_ = auVar58._4_4_ * auVar50._4_4_;
          auVar202._8_4_ = auVar58._8_4_ * auVar50._8_4_;
          auVar202._12_4_ = auVar58._12_4_ * auVar50._12_4_;
          auVar59 = vinsertps_avx(auVar213,auVar169,0x4c);
          auVar214._0_4_ = auVar58._0_4_ * auVar59._0_4_;
          auVar214._4_4_ = auVar58._4_4_ * auVar59._4_4_;
          auVar214._8_4_ = auVar58._8_4_ * auVar59._8_4_;
          auVar214._12_4_ = auVar58._12_4_ * auVar59._12_4_;
          auVar58 = vminps_avx(auVar202,auVar214);
          auVar53 = vaddps_avx512vl(auVar53,auVar58);
          auVar58 = vmaxps_avx(auVar214,auVar202);
          auVar203._0_4_ = auVar60._0_4_ + auVar58._0_4_;
          auVar203._4_4_ = auVar60._4_4_ + auVar58._4_4_;
          auVar203._8_4_ = auVar60._8_4_ + auVar58._8_4_;
          auVar203._12_4_ = auVar60._12_4_ + auVar58._12_4_;
          auVar215._8_8_ = 0x3f80000000000000;
          auVar215._0_8_ = 0x3f80000000000000;
          auVar60 = vsubps_avx(auVar215,auVar203);
          auVar58 = vsubps_avx(auVar215,auVar53);
          auVar53 = vsubps_avx(auVar157,auVar54);
          auVar54 = vsubps_avx(auVar51,auVar54);
          fVar209 = auVar53._0_4_;
          auVar240._0_4_ = fVar209 * auVar60._0_4_;
          fVar211 = auVar53._4_4_;
          auVar240._4_4_ = fVar211 * auVar60._4_4_;
          fVar229 = auVar53._8_4_;
          auVar240._8_4_ = fVar229 * auVar60._8_4_;
          fVar230 = auVar53._12_4_;
          auVar240._12_4_ = fVar230 * auVar60._12_4_;
          auVar61 = vbroadcastss_avx512vl(auVar47);
          auVar52 = vmulps_avx512vl(auVar61,auVar52);
          auVar49 = vmulps_avx512vl(auVar61,auVar49);
          auVar61 = vminps_avx512vl(auVar52,auVar49);
          auVar52 = vmaxps_avx(auVar49,auVar52);
          auVar182._0_4_ = fVar210 * auVar50._0_4_;
          auVar182._4_4_ = fVar210 * auVar50._4_4_;
          auVar182._8_4_ = fVar210 * auVar50._8_4_;
          auVar182._12_4_ = fVar210 * auVar50._12_4_;
          auVar170._0_4_ = fVar210 * auVar59._0_4_;
          auVar170._4_4_ = fVar210 * auVar59._4_4_;
          auVar170._8_4_ = fVar210 * auVar59._8_4_;
          auVar170._12_4_ = fVar210 * auVar59._12_4_;
          auVar49 = vminps_avx(auVar182,auVar170);
          auVar50 = vaddps_avx512vl(auVar61,auVar49);
          auVar59 = vmulps_avx512vl(auVar53,auVar58);
          fVar195 = auVar54._0_4_;
          auVar204._0_4_ = fVar195 * auVar60._0_4_;
          fVar206 = auVar54._4_4_;
          auVar204._4_4_ = fVar206 * auVar60._4_4_;
          fVar207 = auVar54._8_4_;
          auVar204._8_4_ = fVar207 * auVar60._8_4_;
          fVar208 = auVar54._12_4_;
          auVar204._12_4_ = fVar208 * auVar60._12_4_;
          auVar216._0_4_ = fVar195 * auVar58._0_4_;
          auVar216._4_4_ = fVar206 * auVar58._4_4_;
          auVar216._8_4_ = fVar207 * auVar58._8_4_;
          auVar216._12_4_ = fVar208 * auVar58._12_4_;
          auVar49 = vmaxps_avx(auVar170,auVar182);
          auVar171._0_4_ = auVar52._0_4_ + auVar49._0_4_;
          auVar171._4_4_ = auVar52._4_4_ + auVar49._4_4_;
          auVar171._8_4_ = auVar52._8_4_ + auVar49._8_4_;
          auVar171._12_4_ = auVar52._12_4_ + auVar49._12_4_;
          auVar183._8_8_ = 0x3f800000;
          auVar183._0_8_ = 0x3f800000;
          auVar52 = vsubps_avx(auVar183,auVar171);
          auVar49 = vsubps_avx(auVar183,auVar50);
          auVar234._0_4_ = fVar209 * auVar52._0_4_;
          auVar234._4_4_ = fVar211 * auVar52._4_4_;
          auVar234._8_4_ = fVar229 * auVar52._8_4_;
          auVar234._12_4_ = fVar230 * auVar52._12_4_;
          auVar228._0_4_ = fVar209 * auVar49._0_4_;
          auVar228._4_4_ = fVar211 * auVar49._4_4_;
          auVar228._8_4_ = fVar229 * auVar49._8_4_;
          auVar228._12_4_ = fVar230 * auVar49._12_4_;
          auVar172._0_4_ = fVar195 * auVar52._0_4_;
          auVar172._4_4_ = fVar206 * auVar52._4_4_;
          auVar172._8_4_ = fVar207 * auVar52._8_4_;
          auVar172._12_4_ = fVar208 * auVar52._12_4_;
          auVar184._0_4_ = fVar195 * auVar49._0_4_;
          auVar184._4_4_ = fVar206 * auVar49._4_4_;
          auVar184._8_4_ = fVar207 * auVar49._8_4_;
          auVar184._12_4_ = fVar208 * auVar49._12_4_;
          auVar52 = vminps_avx(auVar234,auVar228);
          auVar49 = vminps_avx(auVar172,auVar184);
          auVar50 = vminps_avx(auVar52,auVar49);
          auVar52 = vmaxps_avx(auVar228,auVar234);
          auVar49 = vmaxps_avx(auVar184,auVar172);
          auVar49 = vmaxps_avx(auVar49,auVar52);
          auVar60 = vminps_avx512vl(auVar240,auVar59);
          auVar52 = vminps_avx(auVar204,auVar216);
          auVar52 = vminps_avx(auVar60,auVar52);
          auVar52 = vhaddps_avx(auVar50,auVar52);
          auVar59 = vmaxps_avx512vl(auVar59,auVar240);
          auVar50 = vmaxps_avx(auVar216,auVar204);
          auVar50 = vmaxps_avx(auVar50,auVar59);
          auVar49 = vhaddps_avx(auVar49,auVar50);
          auVar52 = vshufps_avx(auVar52,auVar52,0xe8);
          auVar49 = vshufps_avx(auVar49,auVar49,0xe8);
          auVar173._0_4_ = auVar52._0_4_ + auVar55._0_4_;
          auVar173._4_4_ = auVar52._4_4_ + auVar55._4_4_;
          auVar173._8_4_ = auVar52._8_4_ + auVar55._8_4_;
          auVar173._12_4_ = auVar52._12_4_ + auVar55._12_4_;
          auVar185._0_4_ = auVar49._0_4_ + auVar55._0_4_;
          auVar185._4_4_ = auVar49._4_4_ + auVar55._4_4_;
          auVar185._8_4_ = auVar49._8_4_ + auVar55._8_4_;
          auVar185._12_4_ = auVar49._12_4_ + auVar55._12_4_;
          auVar52 = vmaxps_avx(auVar157,auVar173);
          auVar49 = vminps_avx(auVar185,auVar51);
          uVar31 = vcmpps_avx512vl(auVar49,auVar52,1);
          auVar52 = vinsertps_avx(auVar56,auVar57,0x10);
          auVar243 = ZEXT1664(auVar52);
          auVar49 = ZEXT416(5);
          if ((uVar31 & 3) == 0) {
            vucomiss_avx512f(auVar102._0_16_);
            auVar101._0_16_ = vxorps_avx512vl(auVar49,auVar49);
            auVar101._16_16_ = auVar163;
            auVar251 = ZEXT1664(auVar101._0_16_);
            local_450 = auVar40._0_4_;
            fStack_44c = auVar40._4_4_;
            fStack_448 = auVar40._8_4_;
            fStack_444 = auVar40._12_4_;
            if ((uint)uVar26 < 4 && (uVar5 == 0 || lVar30 == 0)) {
              bVar11 = false;
              auVar69 = auVar101;
            }
            else {
              lVar30 = 200;
              auVar69 = auVar101;
              do {
                auVar49 = vsubss_avx512f(auVar131,auVar55);
                fVar207 = auVar49._0_4_;
                fVar195 = fVar207 * fVar207 * fVar207;
                fVar208 = auVar55._0_4_;
                fVar206 = fVar208 * 3.0 * fVar207 * fVar207;
                fVar207 = fVar207 * fVar208 * fVar208 * 3.0;
                auVar154._4_4_ = fVar195;
                auVar154._0_4_ = fVar195;
                auVar154._8_4_ = fVar195;
                auVar154._12_4_ = fVar195;
                auVar144._4_4_ = fVar206;
                auVar144._0_4_ = fVar206;
                auVar144._8_4_ = fVar206;
                auVar144._12_4_ = fVar206;
                auVar113._4_4_ = fVar207;
                auVar113._0_4_ = fVar207;
                auVar113._8_4_ = fVar207;
                auVar113._12_4_ = fVar207;
                fVar208 = fVar208 * fVar208 * fVar208;
                auVar159._0_4_ = local_450 * fVar208;
                auVar159._4_4_ = fStack_44c * fVar208;
                auVar159._8_4_ = fStack_448 * fVar208;
                auVar159._12_4_ = fStack_444 * fVar208;
                auVar49 = vfmadd231ps_fma(auVar159,auVar41,auVar113);
                auVar49 = vfmadd231ps_fma(auVar49,auVar42,auVar144);
                auVar49 = vfmadd231ps_fma(auVar49,auVar45,auVar154);
                auVar114._8_8_ = auVar49._0_8_;
                auVar114._0_8_ = auVar49._0_8_;
                auVar49 = vshufpd_avx(auVar49,auVar49,3);
                auVar51 = vshufps_avx(auVar55,auVar55,0x55);
                auVar49 = vsubps_avx(auVar49,auVar114);
                auVar51 = vfmadd213ps_fma(auVar49,auVar51,auVar114);
                fVar195 = auVar51._0_4_;
                auVar49 = vshufps_avx(auVar51,auVar51,0x55);
                auVar115._0_4_ = auVar47._0_4_ * fVar195 + fVar210 * auVar49._0_4_;
                auVar115._4_4_ = auVar47._4_4_ * fVar195 + auVar48._4_4_ * auVar49._4_4_;
                auVar115._8_4_ = auVar47._8_4_ * fVar195 + auVar48._8_4_ * auVar49._8_4_;
                auVar115._12_4_ = auVar47._12_4_ * fVar195 + auVar48._12_4_ * auVar49._12_4_;
                auVar55 = vsubps_avx(auVar55,auVar115);
                auVar49 = vandps_avx512vl(auVar51,auVar245._0_16_);
                auVar69._0_16_ = vprolq_avx512vl(auVar49,0x20);
                auVar49 = vmaxss_avx(auVar69._0_16_,auVar49);
                bVar35 = auVar49._0_4_ <= fVar104;
                if (auVar49._0_4_ < fVar104) {
                  auVar47 = vucomiss_avx512f(auVar101._0_16_);
                  if (bVar35) {
                    auVar48 = vucomiss_avx512f(auVar47);
                    auVar248 = ZEXT1664(auVar48);
                    if (bVar35) {
                      vmovshdup_avx(auVar47);
                      auVar48 = vucomiss_avx512f(auVar101._0_16_);
                      if (bVar35) {
                        auVar131 = vucomiss_avx512f(auVar48);
                        auVar248 = ZEXT1664(auVar131);
                        if (bVar35) {
                          auVar49 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]
                                                         ),ZEXT416((uint)pre->ray_space[k].vy.
                                                                         field_0.m128[2]),0x1c);
                          auVar54 = vinsertps_avx(auVar49,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                          auVar49 = vdpps_avx(auVar54,local_290,0x7f);
                          auVar51 = vdpps_avx(auVar54,local_2a0,0x7f);
                          auVar50 = vdpps_avx(auVar54,local_2b0,0x7f);
                          auVar59 = vdpps_avx(auVar54,local_2c0,0x7f);
                          auVar60 = vdpps_avx(auVar54,local_2d0,0x7f);
                          auVar58 = vdpps_avx(auVar54,local_2e0,0x7f);
                          auVar53 = vdpps_avx(auVar54,local_2f0,0x7f);
                          auVar54 = vdpps_avx(auVar54,local_300,0x7f);
                          auVar55 = vsubss_avx512f(auVar131,auVar48);
                          fVar210 = auVar48._0_4_;
                          auVar48 = vfmadd231ss_fma(ZEXT416((uint)(fVar210 * auVar60._0_4_)),auVar55
                                                    ,auVar49);
                          auVar49 = vfmadd231ss_fma(ZEXT416((uint)(auVar58._0_4_ * fVar210)),auVar55
                                                    ,auVar51);
                          auVar51 = vfmadd231ss_fma(ZEXT416((uint)(auVar53._0_4_ * fVar210)),auVar55
                                                    ,auVar50);
                          auVar50 = vfmadd231ss_fma(ZEXT416((uint)(fVar210 * auVar54._0_4_)),auVar55
                                                    ,auVar59);
                          auVar69._0_16_ = vsubss_avx512f(auVar131,auVar47);
                          auVar160._0_4_ = auVar69._0_4_;
                          fVar210 = auVar160._0_4_ * auVar160._0_4_ * auVar160._0_4_;
                          local_120 = auVar47._0_4_;
                          fVar195 = local_120 * 3.0 * auVar160._0_4_ * auVar160._0_4_;
                          fVar206 = auVar160._0_4_ * local_120 * local_120 * 3.0;
                          fVar208 = local_120 * local_120 * local_120;
                          auVar131 = vfmadd231ss_fma(ZEXT416((uint)(fVar208 * auVar50._0_4_)),
                                                     ZEXT416((uint)fVar206),auVar51);
                          auVar131 = vfmadd231ss_fma(auVar131,ZEXT416((uint)fVar195),auVar49);
                          auVar48 = vfmadd231ss_fma(auVar131,ZEXT416((uint)fVar210),auVar48);
                          fVar207 = auVar48._0_4_;
                          if ((fVar178 <= fVar207) &&
                             (fVar209 = *(float *)(ray + k * 4 + 0x100), fVar207 <= fVar209)) {
                            auVar48 = vshufps_avx(auVar47,auVar47,0x55);
                            auVar49 = vsubps_avx512vl(auVar37,auVar48);
                            fVar211 = auVar48._0_4_;
                            auVar191._0_4_ = fVar211 * (float)local_320._0_4_;
                            fVar229 = auVar48._4_4_;
                            auVar191._4_4_ = fVar229 * (float)local_320._4_4_;
                            fVar230 = auVar48._8_4_;
                            auVar191._8_4_ = fVar230 * fStack_318;
                            fVar231 = auVar48._12_4_;
                            auVar191._12_4_ = fVar231 * fStack_314;
                            auVar205._0_4_ = fVar211 * (float)local_370._0_4_;
                            auVar205._4_4_ = fVar229 * (float)local_370._4_4_;
                            auVar205._8_4_ = fVar230 * fStack_368;
                            auVar205._12_4_ = fVar231 * fStack_364;
                            auVar217._0_4_ = fVar211 * (float)local_380._0_4_;
                            auVar217._4_4_ = fVar229 * (float)local_380._4_4_;
                            auVar217._8_4_ = fVar230 * fStack_378;
                            auVar217._12_4_ = fVar231 * fStack_374;
                            auVar174._0_4_ = fVar211 * (float)local_340._0_4_;
                            auVar174._4_4_ = fVar229 * (float)local_340._4_4_;
                            auVar174._8_4_ = fVar230 * fStack_338;
                            auVar174._12_4_ = fVar231 * fStack_334;
                            auVar37 = vfmadd231ps_fma(auVar191,auVar49,local_310);
                            auVar48 = vfmadd231ps_fma(auVar205,auVar49,local_350);
                            auVar131 = vfmadd231ps_fma(auVar217,auVar49,local_360);
                            auVar49 = vfmadd231ps_fma(auVar174,auVar49,local_330);
                            auVar37 = vsubps_avx(auVar48,auVar37);
                            auVar48 = vsubps_avx(auVar131,auVar48);
                            auVar131 = vsubps_avx(auVar49,auVar131);
                            auVar218._0_4_ = local_120 * auVar48._0_4_;
                            auVar218._4_4_ = local_120 * auVar48._4_4_;
                            auVar218._8_4_ = local_120 * auVar48._8_4_;
                            auVar218._12_4_ = local_120 * auVar48._12_4_;
                            auVar160._4_4_ = auVar160._0_4_;
                            auVar160._8_4_ = auVar160._0_4_;
                            auVar160._12_4_ = auVar160._0_4_;
                            auVar37 = vfmadd231ps_fma(auVar218,auVar160,auVar37);
                            auVar175._0_4_ = local_120 * auVar131._0_4_;
                            auVar175._4_4_ = local_120 * auVar131._4_4_;
                            auVar175._8_4_ = local_120 * auVar131._8_4_;
                            auVar175._12_4_ = local_120 * auVar131._12_4_;
                            auVar48 = vfmadd231ps_fma(auVar175,auVar160,auVar48);
                            auVar176._0_4_ = local_120 * auVar48._0_4_;
                            auVar176._4_4_ = local_120 * auVar48._4_4_;
                            auVar176._8_4_ = local_120 * auVar48._8_4_;
                            auVar176._12_4_ = local_120 * auVar48._12_4_;
                            auVar37 = vfmadd231ps_fma(auVar176,auVar160,auVar37);
                            auVar69._0_16_ = vmulps_avx512vl(auVar37,auVar36);
                            pGVar6 = (context->scene->geometries).items[uVar32].ptr;
                            if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                              bVar35 = false;
                            }
                            else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                    (bVar35 = true,
                                    pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                              auVar155._0_4_ = fVar208 * (float)local_3c0._0_4_;
                              auVar155._4_4_ = fVar208 * (float)local_3c0._4_4_;
                              auVar155._8_4_ = fVar208 * fStack_3b8;
                              auVar155._12_4_ = fVar208 * fStack_3b4;
                              auVar145._4_4_ = fVar206;
                              auVar145._0_4_ = fVar206;
                              auVar145._8_4_ = fVar206;
                              auVar145._12_4_ = fVar206;
                              auVar36 = vfmadd132ps_fma(auVar145,auVar155,local_3b0);
                              auVar138._4_4_ = fVar195;
                              auVar138._0_4_ = fVar195;
                              auVar138._8_4_ = fVar195;
                              auVar138._12_4_ = fVar195;
                              auVar36 = vfmadd132ps_fma(auVar138,auVar36,local_3a0);
                              auVar125._4_4_ = fVar210;
                              auVar125._0_4_ = fVar210;
                              auVar125._8_4_ = fVar210;
                              auVar125._12_4_ = fVar210;
                              auVar48 = vfmadd132ps_fma(auVar125,auVar36,local_390);
                              auVar36 = vshufps_avx(auVar48,auVar48,0xc9);
                              auVar37 = vshufps_avx(auVar69._0_16_,auVar69._0_16_,0xc9);
                              auVar126._0_4_ = auVar48._0_4_ * auVar37._0_4_;
                              auVar126._4_4_ = auVar48._4_4_ * auVar37._4_4_;
                              auVar126._8_4_ = auVar48._8_4_ * auVar37._8_4_;
                              auVar126._12_4_ = auVar48._12_4_ * auVar37._12_4_;
                              auVar36 = vfmsub231ps_fma(auVar126,auVar69._0_16_,auVar36);
                              auVar148._8_4_ = 1;
                              auVar148._0_8_ = 0x100000001;
                              auVar148._12_4_ = 1;
                              auVar148._16_4_ = 1;
                              auVar148._20_4_ = 1;
                              auVar148._24_4_ = 1;
                              auVar148._28_4_ = 1;
                              local_100 = vpermps_avx2(auVar148,ZEXT1632(auVar47));
                              auVar68 = vpermps_avx2(auVar148,ZEXT1632(auVar36));
                              auVar156._8_4_ = 2;
                              auVar156._0_8_ = 0x200000002;
                              auVar156._12_4_ = 2;
                              auVar156._16_4_ = 2;
                              auVar156._20_4_ = 2;
                              auVar156._24_4_ = 2;
                              auVar156._28_4_ = 2;
                              local_160 = vpermps_avx2(auVar156,ZEXT1632(auVar36));
                              local_140 = auVar36._0_4_;
                              local_180[0] = (RTCHitN)auVar68[0];
                              local_180[1] = (RTCHitN)auVar68[1];
                              local_180[2] = (RTCHitN)auVar68[2];
                              local_180[3] = (RTCHitN)auVar68[3];
                              local_180[4] = (RTCHitN)auVar68[4];
                              local_180[5] = (RTCHitN)auVar68[5];
                              local_180[6] = (RTCHitN)auVar68[6];
                              local_180[7] = (RTCHitN)auVar68[7];
                              local_180[8] = (RTCHitN)auVar68[8];
                              local_180[9] = (RTCHitN)auVar68[9];
                              local_180[10] = (RTCHitN)auVar68[10];
                              local_180[0xb] = (RTCHitN)auVar68[0xb];
                              local_180[0xc] = (RTCHitN)auVar68[0xc];
                              local_180[0xd] = (RTCHitN)auVar68[0xd];
                              local_180[0xe] = (RTCHitN)auVar68[0xe];
                              local_180[0xf] = (RTCHitN)auVar68[0xf];
                              local_180[0x10] = (RTCHitN)auVar68[0x10];
                              local_180[0x11] = (RTCHitN)auVar68[0x11];
                              local_180[0x12] = (RTCHitN)auVar68[0x12];
                              local_180[0x13] = (RTCHitN)auVar68[0x13];
                              local_180[0x14] = (RTCHitN)auVar68[0x14];
                              local_180[0x15] = (RTCHitN)auVar68[0x15];
                              local_180[0x16] = (RTCHitN)auVar68[0x16];
                              local_180[0x17] = (RTCHitN)auVar68[0x17];
                              local_180[0x18] = (RTCHitN)auVar68[0x18];
                              local_180[0x19] = (RTCHitN)auVar68[0x19];
                              local_180[0x1a] = (RTCHitN)auVar68[0x1a];
                              local_180[0x1b] = (RTCHitN)auVar68[0x1b];
                              local_180[0x1c] = (RTCHitN)auVar68[0x1c];
                              local_180[0x1d] = (RTCHitN)auVar68[0x1d];
                              local_180[0x1e] = (RTCHitN)auVar68[0x1e];
                              local_180[0x1f] = (RTCHitN)auVar68[0x1f];
                              uStack_13c = local_140;
                              uStack_138 = local_140;
                              uStack_134 = local_140;
                              uStack_130 = local_140;
                              uStack_12c = local_140;
                              uStack_128 = local_140;
                              uStack_124 = local_140;
                              fStack_11c = local_120;
                              fStack_118 = local_120;
                              fStack_114 = local_120;
                              fStack_110 = local_120;
                              fStack_10c = local_120;
                              fStack_108 = local_120;
                              fStack_104 = local_120;
                              local_e0 = local_220._0_8_;
                              uStack_d8 = local_220._8_8_;
                              uStack_d0 = local_220._16_8_;
                              uStack_c8 = local_220._24_8_;
                              local_c0 = local_240;
                              vpcmpeqd_avx2(local_240,local_240);
                              uStack_9c = context->user->instID[0];
                              local_a0 = uStack_9c;
                              uStack_98 = uStack_9c;
                              uStack_94 = uStack_9c;
                              uStack_90 = uStack_9c;
                              uStack_8c = uStack_9c;
                              uStack_88 = uStack_9c;
                              uStack_84 = uStack_9c;
                              uStack_7c = context->user->instPrimID[0];
                              local_80 = uStack_7c;
                              uStack_78 = uStack_7c;
                              uStack_74 = uStack_7c;
                              uStack_70 = uStack_7c;
                              uStack_6c = uStack_7c;
                              uStack_68 = uStack_7c;
                              uStack_64 = uStack_7c;
                              *(float *)(ray + k * 4 + 0x100) = fVar207;
                              local_3e0 = local_260._0_8_;
                              uStack_3d8 = local_260._8_8_;
                              uStack_3d0 = local_260._16_8_;
                              uStack_3c8 = local_260._24_8_;
                              local_410.valid = (int *)&local_3e0;
                              local_410.geometryUserPtr = pGVar6->userPtr;
                              local_410.context = context->user;
                              local_410.ray = (RTCRayN *)ray;
                              local_410.hit = local_180;
                              local_410.N = 8;
                              if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                (*pGVar6->occlusionFilterN)(&local_410);
                                auVar36 = vxorps_avx512vl(auVar101._0_16_,auVar101._0_16_);
                                auVar251 = ZEXT1664(auVar36);
                                auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                auVar249 = ZEXT1664(auVar36);
                                auVar248 = ZEXT464(0x3f800000);
                                auVar68 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                auVar247 = ZEXT3264(auVar68);
                                auVar69._16_16_ = auVar68._16_16_;
                                auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                auVar246 = ZEXT1664(auVar36);
                                auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar245 = ZEXT1664(auVar36);
                                auVar36 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                auVar244 = ZEXT1664(auVar36);
                                auVar69._0_16_ = vxorps_avx512vl(auVar38,auVar38);
                                auVar252 = ZEXT1664(auVar69._0_16_);
                              }
                              auVar37 = auVar252._0_16_;
                              auVar36 = auVar251._0_16_;
                              auVar22._8_8_ = uStack_3d8;
                              auVar22._0_8_ = local_3e0;
                              auVar22._16_8_ = uStack_3d0;
                              auVar22._24_8_ = uStack_3c8;
                              if (auVar22 == (undefined1  [32])0x0) {
                                bVar35 = false;
                              }
                              else {
                                p_Var7 = context->args->filter;
                                if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                                  (*p_Var7)(&local_410);
                                  auVar36 = vxorps_avx512vl(auVar36,auVar36);
                                  auVar251 = ZEXT1664(auVar36);
                                  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                  auVar249 = ZEXT1664(auVar36);
                                  auVar248 = ZEXT464(0x3f800000);
                                  auVar68 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar247 = ZEXT3264(auVar68);
                                  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                  auVar246 = ZEXT1664(auVar36);
                                  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar245 = ZEXT1664(auVar36);
                                  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar244 = ZEXT1664(auVar36);
                                  auVar36 = vxorps_avx512vl(auVar37,auVar37);
                                  auVar252 = ZEXT1664(auVar36);
                                }
                                auVar23._8_8_ = uStack_3d8;
                                auVar23._0_8_ = local_3e0;
                                auVar23._16_8_ = uStack_3d0;
                                auVar23._24_8_ = uStack_3c8;
                                uVar31 = vptestmd_avx512vl(auVar23,auVar23);
                                auVar68 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                bVar35 = (bool)((byte)uVar31 & 1);
                                auVar69._0_4_ =
                                     (uint)bVar35 * auVar68._0_4_ |
                                     (uint)!bVar35 * *(int *)(local_410.ray + 0x100);
                                bVar35 = (bool)((byte)(uVar31 >> 1) & 1);
                                auVar69._4_4_ =
                                     (uint)bVar35 * auVar68._4_4_ |
                                     (uint)!bVar35 * *(int *)(local_410.ray + 0x104);
                                bVar35 = (bool)((byte)(uVar31 >> 2) & 1);
                                auVar69._8_4_ =
                                     (uint)bVar35 * auVar68._8_4_ |
                                     (uint)!bVar35 * *(int *)(local_410.ray + 0x108);
                                bVar35 = (bool)((byte)(uVar31 >> 3) & 1);
                                auVar69._12_4_ =
                                     (uint)bVar35 * auVar68._12_4_ |
                                     (uint)!bVar35 * *(int *)(local_410.ray + 0x10c);
                                bVar35 = (bool)((byte)(uVar31 >> 4) & 1);
                                auVar69._16_4_ =
                                     (uint)bVar35 * auVar68._16_4_ |
                                     (uint)!bVar35 * *(int *)(local_410.ray + 0x110);
                                bVar35 = (bool)((byte)(uVar31 >> 5) & 1);
                                auVar69._20_4_ =
                                     (uint)bVar35 * auVar68._20_4_ |
                                     (uint)!bVar35 * *(int *)(local_410.ray + 0x114);
                                bVar35 = (bool)((byte)(uVar31 >> 6) & 1);
                                auVar69._24_4_ =
                                     (uint)bVar35 * auVar68._24_4_ |
                                     (uint)!bVar35 * *(int *)(local_410.ray + 0x118);
                                bVar35 = SUB81(uVar31 >> 7,0);
                                auVar69._28_4_ =
                                     (uint)bVar35 * auVar68._28_4_ |
                                     (uint)!bVar35 * *(int *)(local_410.ray + 0x11c);
                                *(undefined1 (*) [32])(local_410.ray + 0x100) = auVar69;
                                bVar35 = auVar23 != (undefined1  [32])0x0;
                              }
                              if (!bVar35) {
                                *(float *)(ray + k * 4 + 0x100) = fVar209;
                              }
                            }
                            auVar243 = ZEXT1664(auVar52);
                            bVar34 = (bool)(bVar34 | bVar35);
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar30 = lVar30 + -1;
              } while (lVar30 != 0);
            }
          }
          else {
            auVar36 = vxorps_avx512vl(ZEXT416(5),auVar49);
            auVar251 = ZEXT1664(auVar36);
            auVar69._16_16_ = auVar163;
            auVar69._0_16_ = auVar109;
          }
        }
        else {
          auVar243 = ZEXT1664(auVar241);
          auVar102._16_16_ = auVar163;
          auVar69 = auVar102;
        }
      }
    } while (bVar11);
    auVar36 = vinsertps_avx512f(auVar102._0_16_,auVar39,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }